

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  ImBitVector *this_00;
  uint *puVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  stbtt__point sVar4;
  stbtt__point sVar5;
  undefined4 uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  ImWchar IVar10;
  undefined2 uVar11;
  uint uVar12;
  ImFont *pIVar13;
  ImFont *pIVar14;
  undefined1 e [8];
  undefined8 *puVar15;
  ImFontConfig *pIVar16;
  long lVar17;
  char cVar18;
  char cVar23;
  undefined1 auVar31 [12];
  undefined1 auVar32 [15];
  undefined1 auVar33 [14];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [14];
  undefined1 auVar38 [16];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined4 uVar43;
  undefined4 uVar44;
  stbtt__buf fontdict;
  undefined1 auVar45 [15];
  unkuint9 Var46;
  undefined1 auVar47 [15];
  undefined1 auVar48 [13];
  undefined1 auVar49 [14];
  undefined1 auVar50 [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [15];
  unkbyte10 Var53;
  uint6 uVar54;
  undefined1 auVar55 [14];
  undefined1 auVar56 [16];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  stbtt__active_edge **ppsVar59;
  bool bVar60;
  ushort uVar61;
  short sVar62;
  stbtt_uint32 sVar63;
  uint uVar70;
  int iVar71;
  void *p;
  ulong uVar72;
  stbtt_uint32 sVar64;
  stbtt_uint32 sVar65;
  stbtt_uint32 sVar66;
  stbtt_uint32 sVar67;
  stbtt_uint32 sVar68;
  stbtt_uint32 sVar69;
  void *pvVar73;
  int *piVar74;
  void *pvVar75;
  void *pvVar76;
  stbrp_context *ptr;
  uchar *puVar77;
  stbtt__buf *scanline;
  undefined1 auVar78 [8];
  undefined8 *puVar79;
  stbtt__active_edge *psVar80;
  stbtt__buf *psVar81;
  short sVar82;
  long lVar83;
  ImWchar *pIVar84;
  char *__function;
  int iVar85;
  int iVar86;
  ulong uVar87;
  long lVar88;
  stbtt_fontinfo *psVar89;
  stbtt__point *ptr_00;
  size_t sVar90;
  int iVar91;
  float fVar92;
  ushort *puVar93;
  stbtt__edge *psVar94;
  ulong uVar95;
  uint *ptr_01;
  stbrp_node **ppsVar96;
  byte *pbVar97;
  uint uVar98;
  long lVar99;
  stbtt__edge *psVar100;
  uint uVar101;
  ImFontConfig *pIVar102;
  ulong uVar103;
  int iVar104;
  int iVar105;
  byte *pbVar106;
  ImFontAtlas *pIVar107;
  bool bVar108;
  ImU32 bit_n;
  long lVar109;
  long lVar110;
  bool bVar111;
  byte bVar112;
  short sVar113;
  char cVar119;
  char cVar122;
  ushort uVar120;
  short sVar121;
  short sVar123;
  short sVar124;
  short sVar125;
  undefined1 auVar114 [16];
  char cVar118;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar126;
  uint uVar130;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  uint uVar131;
  uint uVar135;
  undefined1 auVar132 [16];
  uint uVar136;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  uint uVar137;
  uint uVar141;
  undefined1 in_XMM3 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  uint uVar142;
  undefined1 auVar140 [16];
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  float fVar154;
  float fVar155;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar156;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar157;
  float fVar162;
  uint uVar163;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar164;
  float fVar165;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar166;
  undefined4 uVar167;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar172 [16];
  float fVar177;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined4 uVar184;
  uint uVar194;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  stbtt__buf sVar202;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0c [12];
  void *local_4e0;
  ImFontAtlas *atlas_00;
  stbtt_uint32 local_48c;
  undefined1 local_488 [8];
  undefined8 uStack_480;
  uint local_46c;
  undefined1 local_468 [16];
  ulong local_458;
  stbtt__point *local_450;
  undefined1 local_448 [8];
  stbrp_node *local_440;
  stbtt__edge *local_438;
  float local_42c;
  undefined1 local_428 [16];
  void *local_418;
  stbtt__active_edge *local_410;
  undefined8 local_408;
  uint local_400;
  float local_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  void *pvStack_3e0;
  ulong local_3d8;
  ulong local_3d0;
  int local_3c4;
  int local_3c0;
  float local_3bc;
  long local_3b8;
  stbtt_fontinfo *local_3b0;
  undefined8 *local_3a8;
  long local_3a0;
  long local_398;
  void *pvStack_390;
  uchar *local_380;
  ulong local_378;
  ulong local_370;
  long local_368;
  float *local_360;
  int local_354;
  uint local_350;
  uint local_34c;
  float local_348;
  int local_344;
  int local_340;
  int local_33c;
  undefined1 local_338 [16];
  stbrp_context *local_328;
  float *local_320;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  size_t local_2f8;
  ImFontConfig *local_2f0;
  long local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  uchar *local_2d0;
  ulong local_2c8;
  short *local_2c0;
  long local_2b8;
  int local_2b0;
  int local_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  stbtt__buf local_238 [32];
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  undefined6 uVar168;
  undefined8 uVar169;
  undefined1 auVar170 [12];
  undefined1 auVar171 [14];
  undefined1 auVar173 [16];
  undefined6 uVar185;
  undefined8 uVar186;
  undefined1 auVar187 [12];
  undefined1 auVar188 [14];
  undefined1 auVar192 [16];
  
  local_428._8_8_ = local_428._0_8_;
  local_338._8_8_ = local_338._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                  ,0x92b,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  local_4e0 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar12 = (atlas->ConfigData).Size;
  lVar83 = (long)(int)uVar12;
  if (0 < lVar83) {
    uVar72 = 8;
    if (8 < uVar12) {
      uVar72 = (ulong)uVar12;
    }
    local_4e0 = ImGui::MemAlloc(uVar72 * 0x110);
  }
  uVar98 = (atlas->Fonts).Size;
  lVar110 = (long)(int)uVar98;
  if (lVar110 < 1) {
    pvVar73 = (void *)0x0;
  }
  else {
    uVar72 = 8;
    if (8 < uVar98) {
      uVar72 = (ulong)uVar98;
    }
    pvVar73 = ImGui::MemAlloc(uVar72 << 5);
  }
  local_2f8 = lVar83 * 0x110;
  memset(local_4e0,0,local_2f8);
  local_338._0_8_ = lVar110 << 5;
  memset(pvVar73,0,lVar110 << 5);
  local_428._0_8_ = lVar110;
  if (0 < (atlas->ConfigData).Size) {
    uVar98 = 0;
    if (0 < (int)uVar12) {
      uVar98 = uVar12;
    }
    uVar167 = 0;
    lVar99 = 0;
    do {
      if (lVar99 == CONCAT44(uVar167,uVar98)) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_0016d573;
      }
      pIVar102 = (atlas->ConfigData).Data;
      pIVar13 = pIVar102[lVar99].DstFont;
      if ((pIVar13 == (ImFont *)0x0) ||
         (pIVar13->ContainerAtlas != atlas && pIVar13->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                      ,0x943,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)local_4e0 + lVar99 * 0x110 + 0xe0) = 0xffffffff;
      uVar72 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar72 < 1) {
LAB_0016d5bb:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                      ,0x94c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar102 = pIVar102 + lVar99;
      uVar87 = 0;
      while (pIVar14 = (atlas->Fonts).Data[uVar87], pIVar13 != pIVar14) {
        uVar87 = uVar87 + 1;
        if ((uVar72 <= uVar87) || (pIVar13 == pIVar14)) goto LAB_0016d5bb;
      }
      *(int *)((long)local_4e0 + lVar99 * 0x110 + 0xe0) = (int)uVar87;
      pbVar106 = (byte *)pIVar102->FontData;
      iVar85 = pIVar102->FontNo;
      bVar112 = *pbVar106;
      local_3f8._0_8_ = lVar99;
      if (bVar112 < 0x4f) {
        if (bVar112 == 0) {
          if (pbVar106[1] != 1) goto LAB_0016d651;
        }
        else if ((bVar112 != 0x31) || (pbVar106[1] != 0)) goto LAB_0016d651;
        if ((pbVar106[2] != 0) || (pbVar106[3] != 0)) goto LAB_0016d651;
LAB_00169fab:
        sVar69 = -(uint)(iVar85 != 0);
      }
      else {
        if (bVar112 == 0x4f) {
          if (((pbVar106[1] != 0x54) || (pbVar106[2] != 0x54)) || (pbVar106[3] != 0x4f))
          goto LAB_0016d651;
          goto LAB_00169fab;
        }
        if (bVar112 != 0x74) goto LAB_0016d651;
        bVar112 = pbVar106[1];
        if (bVar112 == 0x72) {
          if ((pbVar106[2] != 0x75) || (pbVar106[3] != 0x65)) goto LAB_0016d651;
          goto LAB_00169fab;
        }
        if (bVar112 != 0x74) {
          if (((bVar112 != 0x79) || (pbVar106[2] != 0x70)) || (pbVar106[3] != 0x31))
          goto LAB_0016d651;
          goto LAB_00169fab;
        }
        if ((pbVar106[2] != 99) || (pbVar106[3] != 0x66)) goto LAB_0016d651;
        uVar70 = *(uint *)(pbVar106 + 4);
        uVar70 = uVar70 >> 0x18 | (uVar70 & 0xff0000) >> 8 | (uVar70 & 0xff00) << 8 | uVar70 << 0x18
        ;
        if (((uVar70 != 0x20000) && (uVar70 != 0x10000)) ||
           (uVar70 = *(uint *)(pbVar106 + 8),
           (int)(uVar70 >> 0x18 | (uVar70 & 0xff0000) >> 8 | (uVar70 & 0xff00) << 8 | uVar70 << 0x18
                ) <= iVar85)) goto LAB_0016d651;
        uVar70 = *(uint *)(pbVar106 + (long)iVar85 * 4 + 0xc);
        sVar69 = uVar70 >> 0x18 | (uVar70 & 0xff0000) >> 8 | (uVar70 & 0xff00) << 8 | uVar70 << 0x18
        ;
      }
      if ((int)sVar69 < 0) {
LAB_0016d651:
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                      ,0x951,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(byte **)((long)local_4e0 + lVar99 * 0x110 + 8) = pbVar106;
      *(stbtt_uint32 *)((long)local_4e0 + lVar99 * 0x110 + 0x10) = sVar69;
      *(undefined8 *)((long)local_4e0 + lVar99 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)local_4e0 + lVar99 * 0x110 + 0x48) = 0;
      sVar63 = stbtt__find_table(pbVar106,sVar69,"cmap");
      sVar64 = stbtt__find_table(pbVar106,sVar69,"loca");
      local_450 = (stbtt__point *)CONCAT44(local_450._4_4_,sVar64);
      *(stbtt_uint32 *)((long)local_4e0 + lVar99 * 0x110 + 0x18) = sVar64;
      sVar64 = stbtt__find_table(pbVar106,sVar69,"head");
      *(stbtt_uint32 *)((long)local_4e0 + lVar99 * 0x110 + 0x1c) = sVar64;
      sVar65 = stbtt__find_table(pbVar106,sVar69,"glyf");
      *(stbtt_uint32 *)((long)local_4e0 + lVar99 * 0x110 + 0x20) = sVar65;
      sVar66 = stbtt__find_table(pbVar106,sVar69,"hhea");
      *(stbtt_uint32 *)((long)local_4e0 + lVar99 * 0x110 + 0x24) = sVar66;
      sVar67 = stbtt__find_table(pbVar106,sVar69,"hmtx");
      *(stbtt_uint32 *)((long)local_4e0 + lVar99 * 0x110 + 0x28) = sVar67;
      sVar68 = stbtt__find_table(pbVar106,sVar69,"kern");
      *(stbtt_uint32 *)((long)local_4e0 + lVar99 * 0x110 + 0x2c) = sVar68;
      local_488._0_4_ = sVar69;
      sVar69 = stbtt__find_table(pbVar106,sVar69,"GPOS");
      *(stbtt_uint32 *)((long)local_4e0 + lVar99 * 0x110 + 0x30) = sVar69;
      if ((((sVar63 == 0) || (sVar64 == 0)) || (sVar66 == 0)) || (sVar67 == 0)) {
LAB_0016a7e8:
        if (pvVar73 != (void *)0x0) {
          ImGui::MemFree(pvVar73);
        }
        if (local_4e0 != (void *)0x0) {
          ImGui::MemFree(local_4e0);
        }
        return false;
      }
      if (sVar65 == 0) {
        local_398 = CONCAT44(local_398._4_4_,2);
        local_448 = (undefined1  [8])((ulong)local_448 & 0xffffffff00000000);
        local_408._0_4_ = 0;
        local_48c = 0;
        sVar69 = stbtt__find_table(pbVar106,local_488._0_4_,"CFF ");
        if (sVar69 == 0) goto LAB_0016a7e8;
        *(undefined8 *)((long)local_4e0 + lVar99 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)local_4e0 + lVar99 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)local_4e0 + lVar99 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)local_4e0 + lVar99 * 0x110 + 0x88) = 0;
        *(byte **)((long)local_4e0 + lVar99 * 0x110 + 0x40) = pbVar106 + sVar69;
        *(undefined8 *)((long)local_4e0 + lVar99 * 0x110 + 0x48) = 0x2000000000000000;
        local_238[0].data = *(uchar **)((long)local_4e0 + lVar99 * 0x110 + 0x40);
        local_238[0]._8_8_ = *(undefined8 *)((long)local_4e0 + lVar99 * 0x110 + 0x48);
        if (local_238[0].cursor < -2) {
LAB_0016d797:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                        ,0x482,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        uVar70 = local_238[0].cursor + 2;
        if (local_238[0].size < (int)uVar70) goto LAB_0016d797;
        uVar130 = 0;
        if ((int)uVar70 < local_238[0].size) {
          uVar130 = (uint)local_238[0].data[uVar70];
        }
        if (local_238[0].size < (int)uVar130) goto LAB_0016d797;
        local_238[0].cursor = uVar130;
        stbtt__cff_get_index(local_238);
        sVar202 = stbtt__cff_get_index(local_238);
        _local_3e8 = stbtt__cff_index_get(sVar202,0);
        stbtt__cff_get_index(local_238);
        sVar202 = stbtt__cff_get_index(local_238);
        *(stbtt__buf *)((long)local_4e0 + lVar99 * 0x110 + 0x60) = sVar202;
        stbtt__dict_get_ints((stbtt__buf *)local_3e8,0x11,1,(stbtt_uint32 *)local_448);
        stbtt__dict_get_ints((stbtt__buf *)local_3e8,0x106,1,(stbtt_uint32 *)&local_398);
        stbtt__dict_get_ints((stbtt__buf *)local_3e8,0x124,1,(stbtt_uint32 *)&local_408);
        stbtt__dict_get_ints((stbtt__buf *)local_3e8,0x125,1,&local_48c);
        uVar169 = local_238[0]._8_8_;
        sVar202._4_12_ = in_stack_fffffffffffffb0c;
        sVar202.data._0_4_ = in_stack_fffffffffffffb08;
        fontdict.data._4_4_ = uVar167;
        fontdict.data._0_4_ = uVar98;
        fontdict._8_8_ = atlas;
        sVar202 = stbtt__get_subrs(sVar202,fontdict);
        sVar69 = local_48c;
        *(stbtt__buf *)((long)local_4e0 + lVar99 * 0x110 + 0x70) = sVar202;
        if (((stbtt_uint32)local_398 != 2) || (uVar184 = local_448._0_4_, local_448._0_4_ == 0))
        goto LAB_0016a7e8;
        iVar85 = SUB84(uVar169,4);
        if ((stbtt_uint32)local_408 != 0) {
          uVar72 = (ulong)local_48c;
          if (uVar72 == 0) goto LAB_0016a7e8;
          if (((int)(stbtt_uint32)local_408 < 0) ||
             (SUB84(uVar169,4) < (int)(stbtt_uint32)local_408)) goto LAB_0016d797;
          local_238[0].cursor = (stbtt_uint32)local_408;
          sVar202 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)local_4e0 + lVar99 * 0x110 + 0x80) = sVar202;
          puVar77 = local_238[0].data + uVar72;
          lVar110 = (ulong)(local_238[0].size - sVar69) << 0x20;
          if ((int)(local_238[0].size - sVar69 | sVar69) < 0 || local_238[0].size < (int)sVar69) {
            puVar77 = (uchar *)0x0;
            lVar110 = 0;
          }
          *(uchar **)((long)local_4e0 + lVar99 * 0x110 + 0x90) = puVar77;
          *(long *)((long)local_4e0 + lVar99 * 0x110 + 0x98) = lVar110;
          iVar85 = local_238[0].size;
        }
        if (((int)uVar184 < 0) || (iVar85 < (int)uVar184)) goto LAB_0016d797;
        local_238[0].cursor = uVar184;
        sVar202 = stbtt__cff_get_index(local_238);
        *(stbtt__buf *)((long)local_4e0 + lVar99 * 0x110 + 0x50) = sVar202;
      }
      else if ((int)local_450 == 0) goto LAB_0016a7e8;
      sVar69 = stbtt__find_table(pbVar106,local_488._0_4_,"maxp");
      if (sVar69 == 0) {
        uVar70 = 0xffff;
      }
      else {
        uVar70 = (uint)(ushort)(*(ushort *)(pbVar106 + (ulong)sVar69 + 4) << 8 |
                               *(ushort *)(pbVar106 + (ulong)sVar69 + 4) >> 8);
      }
      *(uint *)((long)local_4e0 + lVar99 * 0x110 + 0x14) = uVar70;
      *(undefined4 *)((long)local_4e0 + lVar99 * 0x110 + 0x34) = 0xffffffff;
      uVar61 = *(ushort *)(pbVar106 + (ulong)sVar63 + 2) << 8 |
               *(ushort *)(pbVar106 + (ulong)sVar63 + 2) >> 8;
      *(undefined4 *)((long)local_4e0 + lVar99 * 0x110 + 0x38) = 0;
      if (uVar61 == 0) goto LAB_0016a7e8;
      uVar70 = sVar63 + 4;
      uVar72 = (ulong)uVar61;
      iVar85 = 0;
      do {
        uVar61 = *(ushort *)(pbVar106 + uVar70) << 8 | *(ushort *)(pbVar106 + uVar70) >> 8;
        if ((uVar61 == 0) ||
           ((uVar61 == 3 &&
            ((uVar61 = *(ushort *)(pbVar106 + (ulong)uVar70 + 2) << 8 |
                       *(ushort *)(pbVar106 + (ulong)uVar70 + 2) >> 8, uVar61 == 10 || (uVar61 == 1)
             ))))) {
          uVar130 = *(uint *)(pbVar106 + (ulong)uVar70 + 4);
          iVar85 = (uVar130 >> 0x18 | (uVar130 & 0xff0000) >> 8 | (uVar130 & 0xff00) << 8 |
                   uVar130 << 0x18) + sVar63;
          *(int *)((long)local_4e0 + lVar99 * 0x110 + 0x38) = iVar85;
        }
        uVar70 = uVar70 + 8;
        uVar72 = uVar72 - 1;
      } while (uVar72 != 0);
      if (iVar85 == 0) goto LAB_0016a7e8;
      *(uint *)((long)local_4e0 + lVar99 * 0x110 + 0x3c) =
           (uint)(ushort)(*(ushort *)
                           (pbVar106 +
                           (long)*(int *)((long)local_4e0 + lVar99 * 0x110 + 0x1c) + 0x32) << 8 |
                         *(ushort *)
                          (pbVar106 + (long)*(int *)((long)local_4e0 + lVar99 * 0x110 + 0x1c) + 0x32
                          ) >> 8);
      iVar85 = *(int *)((long)local_4e0 + lVar99 * 0x110 + 0xe0);
      if (((long)iVar85 < 0) || (local_428._0_4_ <= iVar85)) goto LAB_0016d70b;
      pIVar84 = pIVar102->GlyphRanges;
      if (pIVar84 == (ImWchar *)0x0) {
        pIVar84 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)local_4e0 + lVar99 * 0x110 + 0xd8) = pIVar84;
      IVar10 = *pIVar84;
      while (IVar10 != 0) {
        uVar61 = pIVar84[1];
        if (uVar61 == 0) break;
        uVar70 = *(uint *)((long)local_4e0 + lVar99 * 0x110 + 0xe4);
        uVar130 = (uint)uVar61;
        if ((int)(uint)uVar61 < (int)uVar70) {
          uVar130 = uVar70;
        }
        *(uint *)((long)local_4e0 + lVar99 * 0x110 + 0xe4) = uVar130;
        IVar10 = pIVar84[2];
        pIVar84 = pIVar84 + 2;
      }
      piVar74 = (int *)((long)iVar85 * 0x20 + (long)pvVar73);
      *piVar74 = *piVar74 + 1;
      iVar85 = *(int *)((long)local_4e0 + lVar99 * 0x110 + 0xe4);
      if (iVar85 < piVar74[1]) {
        iVar85 = piVar74[1];
      }
      piVar74[1] = iVar85;
      lVar99 = local_3f8._0_8_ + 1;
      lVar110 = local_428._0_8_;
    } while (lVar99 < (atlas->ConfigData).Size);
  }
  iVar85 = (int)lVar110;
  auVar78 = (undefined1  [8])0;
  pIVar107 = atlas;
  if (0 < (int)uVar12) {
    lVar99 = 0;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uStack_480;
    _local_488 = auVar127 << 0x40;
    do {
      lVar109 = lVar99 * 0x110;
      iVar85 = *(int *)((long)local_4e0 + lVar109 + 0xe0);
      lVar88 = (long)iVar85;
      if ((lVar88 < 0) || ((int)lVar110 <= iVar85)) goto LAB_0016d70b;
      this_00 = (ImBitVector *)((long)local_4e0 + lVar109 + 0xf0);
      ImBitVector::Create(this_00,*(int *)((long)local_4e0 + lVar109 + 0xe4) + 1);
      this = (ImBitVector *)((long)pvVar73 + lVar88 * 0x20 + 0x10);
      if (*(int *)((long)pvVar73 + lVar88 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)((long)pvVar73 + lVar88 * 0x20 + 4) + 1);
      }
      puVar93 = *(ushort **)((long)local_4e0 + lVar109 + 0xd8);
      uVar61 = *puVar93;
      for (; (uVar61 != 0 && (puVar93[1] != 0)); puVar93 = puVar93 + 2) {
        if (uVar61 <= puVar93[1]) {
          uVar98 = (uint)uVar61;
          do {
            bVar60 = ImBitVector::TestBit(this,uVar98);
            if ((!bVar60) &&
               (iVar85 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)local_4e0 + lVar109 + 8),
                                    *(int *)((long)local_4e0 + lVar109 + 0x38)), iVar85 != 0)) {
              piVar74 = (int *)((long)local_4e0 + lVar109 + 0xe8);
              *piVar74 = *piVar74 + 1;
              piVar74 = (int *)((long)pvVar73 + lVar88 * 0x20 + 8);
              *piVar74 = *piVar74 + 1;
              ImBitVector::SetBit(this_00,uVar98);
              ImBitVector::SetBit(this,uVar98);
              auVar127 = _local_488;
              iVar85 = local_488._0_4_;
              local_488._4_4_ = 0;
              local_488._0_4_ = iVar85 + 1;
              uStack_480 = auVar127._8_8_;
            }
            bVar60 = uVar98 < puVar93[1];
            uVar98 = uVar98 + 1;
          } while (bVar60);
        }
        uVar61 = puVar93[2];
      }
      lVar99 = lVar99 + 1;
      iVar85 = local_428._0_4_;
      lVar110 = local_428._0_8_;
    } while (lVar99 != lVar83);
    pIVar107 = atlas;
    if ((int)uVar12 < 1) {
      auVar78 = local_488;
    }
    else {
      lVar110 = 0;
      do {
        lVar99 = lVar110 * 0x110;
        iVar85 = *(int *)((long)local_4e0 + lVar99 + 0xe8);
        if (*(int *)((long)local_4e0 + lVar99 + 0x104) < iVar85) {
          pvVar75 = ImGui::MemAlloc((long)iVar85 << 2);
          pvVar76 = *(void **)((long)local_4e0 + lVar99 + 0x108);
          if (pvVar76 != (void *)0x0) {
            memcpy(pvVar75,pvVar76,(long)*(int *)((long)local_4e0 + lVar99 + 0x100) << 2);
            ImGui::MemFree(*(void **)((long)local_4e0 + lVar99 + 0x108));
          }
          *(void **)((long)local_4e0 + lVar99 + 0x108) = pvVar75;
          *(int *)((long)local_4e0 + lVar99 + 0x104) = iVar85;
        }
        lVar88 = (long)*(int *)((long)local_4e0 + lVar99 + 0xf0);
        ptr_01 = *(uint **)((long)local_4e0 + lVar99 + 0xf8);
        if (0 < lVar88) {
          local_3f8._0_8_ = lVar110;
          puVar1 = ptr_01 + lVar88;
          iVar85 = 0;
          atlas = pIVar107;
          do {
            uVar98 = *ptr_01;
            if (uVar98 != 0) {
              uVar70 = 0;
              do {
                if ((uVar98 >> (uVar70 & 0x1f) & 1) != 0) {
                  iVar91 = *(int *)((long)local_4e0 + lVar99 + 0x100);
                  if (iVar91 == *(int *)((long)local_4e0 + lVar99 + 0x104)) {
                    if (iVar91 == 0) {
                      iVar71 = 8;
                    }
                    else {
                      iVar71 = iVar91 / 2 + iVar91;
                    }
                    iVar86 = iVar91 + 1;
                    if (iVar91 + 1 < iVar71) {
                      iVar86 = iVar71;
                    }
                    pvVar76 = ImGui::MemAlloc((long)iVar86 << 2);
                    pvVar75 = *(void **)((long)local_4e0 + lVar99 + 0x108);
                    if (pvVar75 != (void *)0x0) {
                      memcpy(pvVar76,pvVar75,(long)*(int *)((long)local_4e0 + lVar99 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)local_4e0 + lVar99 + 0x108));
                    }
                    *(void **)((long)local_4e0 + lVar99 + 0x108) = pvVar76;
                    *(int *)((long)local_4e0 + lVar99 + 0x104) = iVar86;
                    iVar91 = *(int *)((long)local_4e0 + lVar99 + 0x100);
                  }
                  else {
                    pvVar76 = *(void **)((long)local_4e0 + lVar99 + 0x108);
                  }
                  *(uint *)((long)pvVar76 + (long)iVar91 * 4) = iVar85 + uVar70;
                  piVar74 = (int *)((long)local_4e0 + lVar99 + 0x100);
                  *piVar74 = *piVar74 + 1;
                }
                uVar70 = uVar70 + 1;
              } while (uVar70 != 0x20);
            }
            ptr_01 = ptr_01 + 1;
            iVar85 = iVar85 + 0x20;
          } while (ptr_01 < puVar1);
          ptr_01 = *(uint **)((long)local_4e0 + lVar99 + 0xf8);
          lVar110 = local_3f8._0_8_;
          pIVar107 = atlas;
        }
        if (ptr_01 != (uint *)0x0) {
          *(undefined8 *)((long)local_4e0 + lVar99 + 0xf0) = 0;
          ImGui::MemFree(ptr_01);
          *(undefined8 *)((long)local_4e0 + lVar99 + 0xf8) = 0;
        }
        if (*(int *)((long)local_4e0 + lVar99 + 0x100) != *(int *)((long)local_4e0 + lVar99 + 0xe8))
        {
          __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                        ,0x980,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        lVar110 = lVar110 + 1;
      } while (lVar110 != lVar83);
      iVar85 = local_428._0_4_;
      auVar78 = local_488;
    }
  }
  if (iVar85 < 1) {
    if (pvVar73 != (void *)0x0) goto LAB_0016a85f;
  }
  else {
    lVar110 = 0;
    uVar169 = local_338._0_8_;
    do {
      pvVar76 = *(void **)((long)pvVar73 + lVar110 + 0x18);
      if (pvVar76 != (void *)0x0) {
        *(undefined8 *)((long)pvVar73 + lVar110 + 0x10) = 0;
        ImGui::MemFree(pvVar76);
        *(undefined8 *)((long)pvVar73 + lVar110 + 0x18) = 0;
      }
      lVar110 = lVar110 + 0x20;
    } while (uVar169 != lVar110);
LAB_0016a85f:
    ImGui::MemFree(pvVar73);
  }
  _local_3e8 = (stbtt__buf)ZEXT816(0);
  local_398 = 0;
  pvStack_390 = (void *)0x0;
  uVar98 = SUB84(auVar78,0);
  if ((int)uVar98 < 1) {
    local_3e8._0_4_ = uVar98;
    pvVar73 = (void *)0x0;
  }
  else {
    uVar72 = 8;
    if (8 < uVar98) {
      uVar72 = (ulong)auVar78 & 0xffffffff;
    }
    pvVar73 = ImGui::MemAlloc(uVar72 * 0x18);
    pvStack_3e0 = pvVar73;
    local_3e8._4_4_ = (int)uVar72;
    uVar72 = 8;
    if (8 < uVar98) {
      uVar72 = (ulong)auVar78 & 0xffffffff;
    }
    local_3e8._0_4_ = uVar98;
    atlas = pIVar107;
    pvStack_390 = ImGui::MemAlloc(uVar72 * 0x1c);
    local_398 = uVar72 << 0x20;
    pIVar107 = atlas;
  }
  pvVar76 = pvStack_390;
  local_398 = CONCAT44(local_398._4_4_,uVar98);
  iVar85 = 0;
  memset(pvVar73,0,(long)(int)(uVar98 * 0x18));
  memset(pvVar76,0,(long)(int)(uVar98 * 0x1c));
  fVar126 = 0.0;
  if (0 < (int)uVar12) {
    lVar110 = 0;
    uVar98 = 0;
    uVar70 = 0;
    local_488 = auVar78;
    do {
      iVar91 = *(int *)((long)local_4e0 + lVar110 * 0x110 + 0xe8);
      if (iVar91 != 0) {
        if (((int)uVar98 < 0) || (SUB84(auVar78,0) <= (int)uVar98)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_0016d573;
        }
        psVar89 = (stbtt_fontinfo *)(lVar110 * 0x110 + (long)local_4e0);
        *(void **)&psVar89[1].hmtx = (void *)((ulong)uVar98 * 0x18 + (long)pvVar73);
        if (((int)uVar70 < 0) || (SUB84(auVar78,0) <= (int)uVar70)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_0016d573;
        }
        pvVar75 = (void *)((ulong)uVar70 * 0x1c + (long)pvVar76);
        *(void **)&psVar89[1].gpos = pvVar75;
        if ((atlas->ConfigData).Size <= lVar110) goto LAB_0016d618;
        pIVar102 = (atlas->ConfigData).Data;
        fVar126 = pIVar102[lVar110].SizePixels;
        *(float *)&psVar89[1].userdata = fVar126;
        *(undefined4 *)((long)&psVar89[1].userdata + 4) = 0;
        psVar89[1].data = *(uchar **)&psVar89[1].gsubrs.cursor;
        uVar130 = *(uint *)&psVar89[1].gsubrs.data;
        uVar72 = (ulong)uVar130;
        psVar89[1].fontstart = uVar130;
        *(void **)&psVar89[1].loca = pvVar75;
        *(char *)&psVar89[1].glyf = (char)pIVar102[lVar110].OversampleH;
        *(char *)((long)&psVar89[1].glyf + 1) = (char)pIVar102[lVar110].OversampleV;
        if (fVar126 <= 0.0) {
          fVar126 = -fVar126;
          uVar101 = (uint)(ushort)(*(ushort *)(psVar89->data + (long)psVar89->head + 0x12) << 8 |
                                  *(ushort *)(psVar89->data + (long)psVar89->head + 0x12) >> 8);
        }
        else {
          puVar77 = psVar89->data;
          lVar99 = (long)psVar89->hhea;
          uVar101 = ((int)(short)((ushort)puVar77[lVar99 + 4] << 8) | (uint)puVar77[lVar99 + 5]) -
                    ((int)(short)((ushort)puVar77[lVar99 + 6] << 8) | (uint)puVar77[lVar99 + 7]);
        }
        fVar126 = fVar126 / (float)(int)uVar101;
        uVar98 = uVar98 + iVar91;
        uVar70 = uVar70 + iVar91;
        if (0 < (int)uVar130) {
          local_3f8._0_4_ = uVar98;
          local_428._0_8_ = lVar110;
          iVar91 = atlas->TexGlyphPadding + -1;
          lVar88 = 2;
          lVar99 = 0;
          atlas = pIVar107;
          do {
            if ((int)uVar72 <= lVar99) goto LAB_0016d55e;
            iVar71 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar89->data,psVar89->index_map);
            if (iVar71 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                            ,0x9af,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar89,iVar71,(float)pIVar102[lVar110].OversampleH * fVar126,
                       (float)pIVar102[lVar110].OversampleV * fVar126,fVar126,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_448,(int *)&local_408,(int *)&local_48c);
            iVar71 = (((stbtt_uint32)local_408 + iVar91) - (int)local_238[0].data) +
                     pIVar102[lVar110].OversampleH;
            lVar109 = *(long *)&psVar89[1].hmtx;
            *(int *)(lVar109 + -4 + lVar88 * 4) = iVar71;
            iVar86 = ((local_48c + iVar91) - local_448._0_4_) + pIVar102[lVar110].OversampleV;
            *(int *)(lVar109 + lVar88 * 4) = iVar86;
            iVar85 = iVar85 + iVar86 * iVar71;
            lVar99 = lVar99 + 1;
            uVar72 = (ulong)*(int *)&psVar89[1].gsubrs.data;
            lVar88 = lVar88 + 6;
          } while (lVar99 < (long)uVar72);
          lVar110 = local_428._0_8_;
          auVar78 = local_488;
          uVar98 = local_3f8._0_4_;
          pIVar107 = atlas;
        }
      }
      lVar110 = lVar110 + 1;
    } while (lVar110 != lVar83);
    fVar126 = (float)iVar85;
  }
  if (fVar126 < 0.0) {
    fVar126 = sqrtf(fVar126);
  }
  else {
    fVar126 = SQRT(fVar126);
  }
  atlas->TexHeight = 0;
  fVar92 = (float)atlas->TexDesiredWidth;
  if ((int)fVar92 < 1) {
    iVar85 = (int)fVar126;
    fVar92 = 5.73972e-42;
    if ((iVar85 < 0xb33) && (fVar92 = 2.86986e-42, iVar85 < 0x599)) {
      fVar92 = (float)((uint)(0x2cb < iVar85) * 0x200 + 0x200);
    }
  }
  atlas->TexWidth = (int)fVar92;
  fVar126 = (float)atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar98 = (int)fVar92 - (int)fVar126;
  local_440 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar98 << 4);
  auVar198 = _DAT_001bcf80;
  auVar127 = _DAT_001a6970;
  if ((ptr == (stbrp_context *)0x0) || (local_440 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_440 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_440);
    }
    local_440 = (stbrp_node *)0x0;
    fVar126 = 0.0;
    fVar92 = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar72 = (ulong)(uVar98 - 1);
    if ((int)uVar98 < 2) {
      uVar72 = 0;
    }
    else {
      uVar87 = (ulong)(uVar98 & 0x7ffffffe);
      lVar110 = uVar72 - 1;
      auVar114._8_4_ = (int)lVar110;
      auVar114._0_8_ = lVar110;
      auVar114._12_4_ = (int)((ulong)lVar110 >> 0x20);
      ppsVar96 = &local_440[1].next;
      auVar114 = auVar114 ^ _DAT_001a6970;
      auVar138._8_4_ = 0xffffffff;
      auVar138._0_8_ = 0xffffffffffffffff;
      auVar138._12_4_ = 0xffffffff;
      auVar129 = _DAT_001afc50;
      do {
        auVar147 = auVar129 ^ auVar127;
        auVar158._0_4_ = -(uint)(auVar114._0_4_ < auVar147._0_4_);
        auVar158._4_4_ = -(uint)(auVar114._4_4_ < auVar147._4_4_);
        auVar158._8_4_ = -(uint)(auVar114._8_4_ < auVar147._8_4_);
        auVar158._12_4_ = -(uint)(auVar114._12_4_ < auVar147._12_4_);
        auVar148._4_4_ = -(uint)(auVar147._4_4_ == auVar114._4_4_);
        auVar148._12_4_ = -(uint)(auVar147._12_4_ == auVar114._12_4_);
        auVar148._0_4_ = auVar148._4_4_;
        auVar148._8_4_ = auVar148._12_4_;
        auVar147._4_4_ = auVar158._4_4_;
        auVar147._0_4_ = auVar158._4_4_;
        auVar147._8_4_ = auVar158._12_4_;
        auVar147._12_4_ = auVar158._12_4_;
        auVar147 = auVar147 | auVar148 & auVar158;
        lVar110 = auVar129._8_8_;
        if ((~auVar147._0_4_ & 1) != 0) {
          ppsVar96[-2] = local_440 + auVar129._0_8_ + 1;
        }
        if (((auVar147 ^ auVar138) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar96 = local_440 + (lVar110 - auVar138._8_8_);
        }
        auVar129._0_8_ = auVar129._0_8_ + auVar198._0_8_;
        auVar129._8_8_ = lVar110 + auVar198._8_8_;
        ppsVar96 = ppsVar96 + 4;
        uVar87 = uVar87 - 2;
      } while (uVar87 != 0);
    }
    local_440[uVar72].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_440;
    ptr->active_head = ptr->extra;
    ptr->width = uVar98;
    ptr->height = 0x8000 - (int)fVar126;
    ptr->num_nodes = uVar98;
    ptr->align = (int)((uVar98 - 1) + uVar98) / (int)uVar98;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = uVar98;
    ptr->extra[1].y = 0x40000000;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_328 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar107,ptr);
  if (0 < (int)uVar12) {
    lVar110 = 0;
    do {
      lVar99 = lVar110 * 0x110;
      iVar85 = *(int *)((long)local_4e0 + lVar99 + 0xe8);
      if (iVar85 != 0) {
        stbrp_pack_rects(local_328,*(stbrp_rect **)((long)local_4e0 + lVar99 + 200),iVar85);
        lVar88 = (long)*(int *)((long)local_4e0 + lVar99 + 0xe8);
        if (0 < lVar88) {
          lVar99 = *(long *)((long)local_4e0 + lVar99 + 200);
          lVar109 = 0;
          do {
            if (*(int *)(lVar99 + 0x14 + lVar109) != 0) {
              iVar85 = *(int *)(lVar99 + 8 + lVar109) + *(int *)(lVar99 + 0x10 + lVar109);
              if (iVar85 < pIVar107->TexHeight) {
                iVar85 = pIVar107->TexHeight;
              }
              pIVar107->TexHeight = iVar85;
            }
            lVar109 = lVar109 + 0x18;
          } while (lVar88 * 0x18 != lVar109);
        }
      }
      lVar110 = lVar110 + 1;
    } while (lVar110 != lVar83);
  }
  uVar98 = pIVar107->TexHeight;
  if ((pIVar107->Flags & 1) == 0) {
    uVar98 = (int)(uVar98 - 1) >> 1 | uVar98 - 1;
    uVar98 = (int)uVar98 >> 2 | uVar98;
    uVar98 = (int)uVar98 >> 4 | uVar98;
    uVar98 = (int)uVar98 >> 8 | uVar98;
    uVar98 = (int)uVar98 >> 0x10 | uVar98;
  }
  iVar85 = uVar98 + 1;
  pIVar107->TexHeight = iVar85;
  auVar198._0_4_ = (float)pIVar107->TexWidth;
  auVar198._4_4_ = (float)iVar85;
  auVar198._8_8_ = 0;
  auVar127 = divps(_DAT_001a7610,auVar198);
  pIVar107->TexUvScale = auVar127._0_8_;
  puVar77 = (uchar *)ImGui::MemAlloc((long)(iVar85 * pIVar107->TexWidth));
  pIVar107->TexPixelsAlpha8 = puVar77;
  atlas_00 = pIVar107;
  local_42c = fVar92;
  memset(puVar77,0,(long)pIVar107->TexHeight * (long)pIVar107->TexWidth);
  if (0 < (int)uVar12) {
    local_380 = pIVar107->TexPixelsAlpha8;
    lVar99 = (long)(int)local_42c;
    local_288 = fVar126;
    fStack_284 = fVar126;
    fStack_280 = fVar126;
    fStack_27c = fVar126;
    lVar110 = 0;
    auVar127 = _DAT_001bcf60;
    do {
      auVar198 = _local_488;
      local_3b8 = lVar110;
      if ((pIVar107->ConfigData).Size <= lVar110) goto LAB_0016d618;
      if (*(int *)((long)local_4e0 + lVar110 * 0x110 + 0xe8) != 0) {
        psVar89 = (stbtt_fontinfo *)(lVar110 * 0x110 + (long)local_4e0);
        fVar126 = *(float *)&psVar89[1].userdata;
        auVar149 = ZEXT416((uint)fVar126);
        if (fVar126 <= 0.0) {
          auVar149._0_4_ = -fVar126;
          auVar149._4_4_ = 0x80000000;
          auVar149._8_4_ = 0x80000000;
          auVar149._12_4_ = 0x80000000;
          uVar98 = (uint)(ushort)(*(ushort *)(psVar89->data + (long)psVar89->head + 0x12) << 8 |
                                 *(ushort *)(psVar89->data + (long)psVar89->head + 0x12) >> 8);
        }
        else {
          puVar77 = psVar89->data;
          lVar110 = (long)psVar89->hhea;
          uVar98 = ((int)(short)((ushort)puVar77[lVar110 + 4] << 8) | (uint)puVar77[lVar110 + 5]) -
                   ((int)(short)((ushort)puVar77[lVar110 + 6] << 8) | (uint)puVar77[lVar110 + 7]);
        }
        auVar150._4_12_ = auVar149._4_12_;
        auVar150._0_4_ = auVar149._0_4_ / (float)(int)uVar98;
        local_2f0 = (pIVar107->ConfigData).Data;
        if (0 < psVar89[1].fontstart) {
          lVar110._0_4_ = psVar89[1].hmtx;
          lVar110._4_4_ = psVar89[1].kern;
          uVar72._0_4_ = psVar89[1].glyf;
          uVar72._4_4_ = psVar89[1].hhea;
          auVar32._8_6_ = 0;
          auVar32._0_8_ = uVar72;
          auVar32[0xe] = (char)((uint)uVar72._4_4_ >> 0x18);
          auVar34._8_4_ = 0;
          auVar34._0_8_ = uVar72;
          auVar34[0xc] = (char)((uint)uVar72._4_4_ >> 0x10);
          auVar34._13_2_ = auVar32._13_2_;
          auVar35._8_4_ = 0;
          auVar35._0_8_ = uVar72;
          auVar35._12_3_ = auVar34._12_3_;
          auVar36._8_2_ = 0;
          auVar36._0_8_ = uVar72;
          auVar36[10] = (char)((uint)uVar72._4_4_ >> 8);
          auVar36._11_4_ = auVar35._11_4_;
          auVar39._8_2_ = 0;
          auVar39._0_8_ = uVar72;
          auVar39._10_5_ = auVar36._10_5_;
          auVar40[8] = (char)uVar72._4_4_;
          auVar40._0_8_ = uVar72;
          auVar40._9_6_ = auVar39._9_6_;
          auVar45._7_8_ = 0;
          auVar45._0_7_ = auVar40._8_7_;
          cVar122 = (char)((uint)(undefined4)uVar72 >> 0x18);
          Var46 = CONCAT81(SUB158(auVar45 << 0x40,7),cVar122);
          auVar52._9_6_ = 0;
          auVar52._0_9_ = Var46;
          cVar119 = (char)((uint)(undefined4)uVar72 >> 0x10);
          auVar41[4] = cVar119;
          auVar41._0_4_ = (undefined4)uVar72;
          auVar41._5_10_ = SUB1510(auVar52 << 0x30,5);
          auVar47._11_4_ = 0;
          auVar47._0_11_ = auVar41._4_11_;
          cVar118 = (char)((uint)(undefined4)uVar72 >> 8);
          auVar48._1_12_ = SUB1512(auVar47 << 0x20,3);
          auVar48[0] = cVar118;
          bVar112 = (byte)(undefined4)uVar72;
          uVar61 = CONCAT11(0,bVar112);
          auVar42._2_13_ = auVar48;
          auVar42._0_2_ = uVar61;
          uVar120 = auVar48._0_2_;
          sVar113 = -auVar41._4_2_;
          sVar123 = (short)Var46;
          sVar121 = -sVar123;
          local_458 = (ulong)uVar120;
          auVar33._10_2_ = 0;
          auVar33._0_10_ = auVar42._0_10_;
          auVar33._12_2_ = sVar123;
          uVar54 = CONCAT42(auVar33._10_4_,auVar41._4_2_);
          auVar49._6_8_ = 0;
          auVar49._0_6_ = uVar54;
          auVar37._4_2_ = uVar120;
          auVar37._0_4_ = auVar42._0_4_;
          auVar37._6_8_ = SUB148(auVar49 << 0x40,6);
          auVar115._0_4_ = (float)uVar61;
          auVar115._4_4_ = (float)auVar37._4_4_;
          auVar115._8_4_ = (float)(int)uVar54;
          auVar115._12_4_ = (float)(auVar33._10_4_ >> 0x10);
          local_278 = divps(_DAT_001a7610,auVar115);
          auVar159[0] = -(bVar112 == 0);
          auVar159[1] = -(bVar112 == 0);
          auVar159[2] = -(bVar112 == 0);
          auVar159[3] = -(bVar112 == 0);
          auVar159[4] = -(cVar118 == '\0');
          auVar159[5] = -(cVar118 == '\0');
          auVar159[6] = -(cVar118 == '\0');
          auVar159[7] = -(cVar118 == '\0');
          auVar159[8] = -(cVar119 == '\0');
          auVar159[9] = -(cVar119 == '\0');
          auVar159[10] = -(cVar119 == '\0');
          auVar159[0xb] = -(cVar119 == '\0');
          auVar159[0xc] = -(cVar122 == '\0');
          auVar159[0xd] = -(cVar122 == '\0');
          auVar159[0xe] = -(cVar122 == '\0');
          auVar159[0xf] = -(cVar122 == '\0');
          Var53 = CONCAT64(CONCAT42(CONCAT22(sVar121,sVar121),sVar113),CONCAT22(sVar113,sVar121));
          auVar50._4_8_ = (long)((unkuint10)Var53 >> 0x10);
          auVar50._2_2_ = 1 - uVar120;
          auVar50._0_2_ = 1 - uVar120;
          auVar128._0_4_ = (float)(int)(short)(1 - uVar61);
          auVar128._4_4_ = (float)(auVar50._0_4_ >> 0x10);
          auVar128._8_4_ = (float)((int)((unkuint10)Var53 >> 0x10) >> 0x10);
          auVar128._12_4_ = (float)(int)sVar121;
          auVar139._0_4_ = auVar150._0_4_ * auVar115._0_4_;
          auVar139._4_4_ = auVar150._0_4_ * auVar115._4_4_;
          auVar139._8_4_ = auVar150._0_4_ * auVar115._8_4_;
          auVar139._12_4_ = auVar150._0_4_ * auVar115._12_4_;
          auVar116._0_4_ = auVar115._0_4_ + auVar115._0_4_;
          auVar116._4_4_ = auVar115._4_4_ + auVar115._4_4_;
          auVar116._8_4_ = auVar115._8_4_ + auVar115._8_4_;
          auVar116._12_4_ = auVar115._12_4_ + auVar115._12_4_;
          auVar129 = divps(auVar128,auVar116);
          local_268 = ~auVar159 & auVar129;
          fVar126 = auVar139._4_4_;
          if (auVar139._0_4_ <= auVar139._4_4_) {
            fVar126 = auVar139._0_4_;
          }
          local_3bc = (0.35 / fVar126) * (0.35 / fVar126);
          local_2a8 = auVar139._4_4_;
          fStack_2a4 = auVar139._4_4_;
          fStack_2a0 = auVar139._4_4_;
          fStack_29c = auVar139._4_4_;
          local_300 = (ulong)((undefined4)uVar72 & 0xff);
          local_308 = (ulong)((uint)(undefined4)uVar72 >> 8 & 0xff);
          local_488._4_4_ = 0;
          local_488._0_4_ = auVar42._0_4_ & 0xff;
          uStack_480 = auVar198._8_8_;
          local_298 = auVar139;
          uVar72 = CONCAT44(auVar139._4_4_,auVar139._0_4_);
          local_258 = uVar72 ^ 0x8000000000000000;
          fStack_250 = auVar139._0_4_;
          fStack_24c = -auVar139._4_4_;
          uVar98 = 0xffffffff;
          lVar88 = 0;
          local_368 = lVar110;
          local_3b0 = psVar89;
          local_468 = auVar150;
          do {
            fVar126 = auVar139._0_4_;
            if (*(int *)(lVar110 + 0x14 + lVar88 * 0x18) != 0) {
              local_3a0 = lVar110 + lVar88 * 0x18;
              if (*(int *)(local_3a0 + 4) == 0) {
                if ((*(int *)(local_3a0 + 8) == 0) && (-1 < (int)uVar98)) {
                  lVar109 = *(long *)&psVar89[1].loca;
                  puVar2 = (undefined4 *)(lVar109 + (ulong)uVar98 * 0x1c);
                  uVar167 = *puVar2;
                  uVar184 = puVar2[1];
                  uVar43 = puVar2[2];
                  uVar44 = puVar2[3];
                  puVar79 = (undefined8 *)(lVar109 + 0xc + (ulong)uVar98 * 0x1c);
                  uVar169 = puVar79[1];
                  puVar15 = (undefined8 *)(lVar109 + 0xc + lVar88 * 0x1c);
                  *puVar15 = *puVar79;
                  puVar15[1] = uVar169;
                  puVar2 = (undefined4 *)(lVar109 + lVar88 * 0x1c);
                  *puVar2 = uVar167;
                  puVar2[1] = uVar184;
                  puVar2[2] = uVar43;
                  puVar2[3] = uVar44;
                }
              }
              else if (*(int *)(local_3a0 + 8) != 0) {
                local_2c0 = (short *)(lVar88 * 0x1c + *(long *)&psVar89[1].loca);
                local_34c = uVar98;
                local_2b8 = lVar88;
                uVar98 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar89->data,psVar89->index_map);
                lVar109 = local_3a0;
                auVar127 = *(undefined1 (*) [16])(local_3a0 + 4);
                auVar31._4_8_ = auVar127._8_8_;
                auVar31._0_4_ = auVar127._4_4_ + (int)fStack_284;
                auVar117._0_8_ = auVar31._0_8_ << 0x20;
                auVar117._8_4_ = auVar127._8_4_ + (int)fStack_280;
                auVar117._12_4_ = auVar127._12_4_ + (int)fStack_27c;
                *(ulong *)(local_3a0 + 4) =
                     CONCAT44(auVar127._4_4_ - (int)fStack_284,auVar127._0_4_ - (int)local_288);
                *(long *)(local_3a0 + 0xc) = auVar117._8_8_;
                puVar77 = psVar89->data;
                uVar61 = *(ushort *)(puVar77 + (long)psVar89->hhea + 0x22) << 8 |
                         *(ushort *)(puVar77 + (long)psVar89->hhea + 0x22) >> 8;
                iVar85 = psVar89->hmtx;
                lVar110 = (ulong)uVar61 * 4 + (long)iVar85 + -4;
                lVar88 = (ulong)uVar61 * 4 + (long)iVar85 + -3;
                if ((int)uVar98 < (int)(uint)uVar61) {
                  lVar110 = (long)(int)(uVar98 * 4) + (long)iVar85;
                  lVar88 = (long)(int)(uVar98 * 4) + 1 + (long)iVar85;
                }
                local_400 = (uint)puVar77[lVar88];
                local_350 = (uint)puVar77[lVar110];
                fVar92 = local_288;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar89,uVar98,(float)local_298._0_4_,local_2a8,local_288,fVar126,
                           &local_340,&local_344,&local_2ac,&local_2b0);
                iVar85 = *(int *)(lVar109 + 0xc);
                iVar91 = *(int *)(lVar109 + 0x10);
                local_3d8 = (ulong)*(uint *)(lVar109 + 4);
                local_3d0 = (ulong)*(uint *)(lVar109 + 8);
                local_310 = (ulong)uVar98;
                uVar98 = stbtt_GetGlyphShape(psVar89,uVar98,(stbtt_vertex **)&local_408);
                local_2c8 = (ulong)(uint)-local_488._0_4_;
                uVar70 = (int)local_3d8 + -local_488._0_4_ + 1;
                local_318 = (ulong)(uint)-(int)local_458;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_3b0,(int)local_310,(float)local_298._0_4_,local_2a8,fVar92,fVar126,
                           (int *)&local_48c,&local_33c,(int *)0x0,(int *)0x0);
                iVar71 = local_33c;
                local_46c = uVar70;
                if (uVar70 != 0) {
                  iVar86 = (int)local_318 + (int)local_3d0 + 1;
                  if ((iVar86 != 0) && (0 < (int)uVar98)) {
                    local_2d0 = local_380 + iVar91 * lVar99 + (long)iVar85;
                    local_3d8 = (ulong)(uint)((int)local_3d8 - local_488._0_4_);
                    local_3d0 = (ulong)(uint)((int)local_3d0 - (int)local_458);
                    lVar110 = CONCAT44(local_408._4_4_,(stbtt_uint32)local_408);
                    local_428._0_4_ = local_48c;
                    lVar88 = 0;
                    uVar70 = 0;
                    do {
                      uVar70 = uVar70 + (*(char *)(lVar110 + 0xc + lVar88) == '\x01');
                      lVar88 = lVar88 + 0xe;
                    } while ((ulong)uVar98 * 0xe != lVar88);
                    if (uVar70 != 0) {
                      uVar72 = (ulong)uVar70;
                      local_418 = ImGui::MemAlloc(uVar72 * 4);
                      if (local_418 != (void *)0x0) {
                        local_3c4 = iVar71;
                        bVar111 = false;
                        iVar85 = 0;
                        local_450 = (stbtt__point *)0x0;
                        iVar91 = 0;
                        bVar60 = true;
                        do {
                          bVar108 = bVar60;
                          if ((bVar111) &&
                             (local_450 = (stbtt__point *)ImGui::MemAlloc((long)iVar91 << 3),
                             local_450 == (stbtt__point *)0x0)) {
                            ImGui::MemFree((void *)0x0);
                            ImGui::MemFree(local_418);
                            goto LAB_0016c44e;
                          }
                          local_238[0].data =
                               (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                          fVar126 = 0.0;
                          fVar92 = 0.0;
                          uVar70 = 0xffffffff;
                          lVar88 = 0;
                          do {
                            iVar91 = (int)local_238[0].data;
                            switch(*(undefined1 *)(lVar110 + 0xc + lVar88)) {
                            case 1:
                              if (-1 < (int)uVar70) {
                                *(int *)((long)local_418 + (ulong)uVar70 * 4) =
                                     (int)local_238[0].data - iVar85;
                              }
                              uVar70 = uVar70 + 1;
                              auVar127 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar88)),
                                                 ZEXT416(*(uint *)(lVar110 + lVar88)),0x60);
                              fVar126 = (float)(auVar127._0_4_ >> 0x10);
                              fVar92 = (float)(auVar127._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              iVar85 = iVar91;
                              if (local_450 != (stbtt__point *)0x0) {
                                local_450[iVar91].x = fVar126;
                                local_450[iVar91].y = fVar92;
                              }
                              break;
                            case 2:
                              lVar109 = (long)(int)local_238[0].data;
                              auVar127 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar88)),
                                                 ZEXT416(*(uint *)(lVar110 + lVar88)),0x60);
                              fVar126 = (float)(auVar127._0_4_ >> 0x10);
                              fVar92 = (float)(auVar127._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              if (local_450 != (stbtt__point *)0x0) {
                                local_450[lVar109].x = fVar126;
                                local_450[lVar109].y = fVar92;
                              }
                              break;
                            case 3:
                              stbtt__tesselate_curve
                                        (local_450,(int *)local_238,fVar126,fVar92,
                                         (float)(int)*(short *)(lVar110 + 4 + lVar88),
                                         (float)(int)*(short *)(lVar110 + 6 + lVar88),
                                         (float)(int)*(short *)(lVar110 + lVar88),
                                         (float)(int)*(short *)(lVar110 + 2 + lVar88),local_3bc,0);
                              goto LAB_0016b68e;
                            case 4:
                              stbtt__tesselate_cubic
                                        (local_450,(int *)local_238,fVar126,fVar92,
                                         (float)(int)*(short *)(lVar110 + 4 + lVar88),
                                         (float)(int)*(short *)(lVar110 + 6 + lVar88),
                                         (float)(int)*(short *)(lVar110 + 8 + lVar88),
                                         (float)(int)*(short *)(lVar110 + 10 + lVar88),
                                         (float)(int)*(short *)(lVar110 + lVar88),
                                         (float)(int)*(short *)(lVar110 + 2 + lVar88),local_3bc,0);
LAB_0016b68e:
                              auVar127 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar88)),
                                                 ZEXT416(*(uint *)(lVar110 + lVar88)),0x60);
                              fVar126 = (float)(auVar127._0_4_ >> 0x10);
                              fVar92 = (float)(auVar127._4_4_ >> 0x10);
                            }
                            ptr_00 = local_450;
                            lVar88 = lVar88 + 0xe;
                          } while ((ulong)uVar98 * 0xe != lVar88);
                          *(int *)((long)local_418 + (long)(int)uVar70 * 4) =
                               (int)local_238[0].data - iVar85;
                          bVar111 = true;
                          iVar91 = (int)local_238[0].data;
                          bVar60 = false;
                        } while (bVar108);
                        if (local_450 != (stbtt__point *)0x0) {
                          uVar87 = 0;
                          lVar110 = 0;
                          do {
                            lVar110 = (long)(int)lVar110 +
                                      (long)*(int *)((long)local_418 + uVar87 * 4);
                            uVar87 = uVar87 + 1;
                          } while (uVar72 != uVar87);
                          local_438 = (stbtt__edge *)ImGui::MemAlloc(lVar110 * 0x14 + 0x14);
                          if (local_438 != (stbtt__edge *)0x0) {
                            uVar87 = 0;
                            uVar98 = 0;
                            iVar85 = 0;
                            do {
                              iVar91 = *(int *)((long)local_418 + uVar87 * 4);
                              if (0 < iVar91) {
                                uVar95 = (ulong)(iVar91 - 1);
                                uVar103 = 0;
                                iVar71 = iVar91;
                                do {
                                  iVar104 = (int)uVar95;
                                  fVar126 = local_450[(long)iVar85 + (long)iVar104].y;
                                  fVar92 = ptr_00[(long)iVar85 + uVar103].y;
                                  if ((fVar126 != fVar92) || (NAN(fVar126) || NAN(fVar92))) {
                                    iVar105 = (int)uVar103;
                                    iVar71 = iVar104;
                                    if (fVar126 <= fVar92) {
                                      iVar71 = iVar105;
                                      iVar105 = iVar104;
                                    }
                                    local_438[(int)uVar98].invert = (uint)(fVar92 < fVar126);
                                    sVar4 = local_450[(long)iVar85 + (long)iVar71];
                                    sVar5 = local_450[(long)iVar85 + (long)iVar105];
                                    psVar94 = local_438 + (int)uVar98;
                                    psVar94->x0 = sVar4.x * (float)local_258._0_4_ + 0.0;
                                    psVar94->y0 = sVar4.y * (float)local_258._4_4_ + 0.0;
                                    psVar94->x1 = sVar5.x * fStack_250 + 0.0;
                                    psVar94->y1 = sVar5.y * fStack_24c + 0.0;
                                    uVar98 = uVar98 + 1;
                                    iVar71 = *(int *)((long)local_418 + uVar87 * 4);
                                  }
                                  uVar95 = uVar103 & 0xffffffff;
                                  uVar103 = uVar103 + 1;
                                } while ((long)uVar103 < (long)iVar71);
                              }
                              iVar85 = iVar85 + iVar91;
                              uVar87 = uVar87 + 1;
                            } while (uVar87 != uVar72);
                            stbtt__sort_edges_quicksort(local_438,uVar98);
                            iVar85 = local_3c4;
                            if (1 < (int)uVar98) {
                              uVar72 = 1;
                              lVar110 = 2;
                              psVar94 = local_438;
                              do {
                                uVar3 = local_438[uVar72].x0;
                                uVar6 = local_438[uVar72].y0;
                                iVar91 = local_438[uVar72].invert;
                                local_238[0].cursor = iVar91;
                                local_238[0].data = *(uchar **)&local_438[uVar72].x1;
                                lVar88 = lVar110;
                                psVar100 = psVar94;
                                do {
                                  if (psVar100->y0 <= (float)uVar6) {
                                    uVar70 = (int)lVar88 - 1;
                                    goto LAB_0016b8e4;
                                  }
                                  psVar100[1].invert = psVar100->invert;
                                  fVar126 = psVar100->y0;
                                  fVar92 = psVar100->x1;
                                  fVar154 = psVar100->y1;
                                  psVar100[1].x0 = psVar100->x0;
                                  psVar100[1].y0 = fVar126;
                                  psVar100[1].x1 = fVar92;
                                  psVar100[1].y1 = fVar154;
                                  lVar88 = lVar88 + -1;
                                  psVar100 = psVar100 + -1;
                                } while (1 < lVar88);
                                uVar70 = 0;
LAB_0016b8e4:
                                if (uVar72 != uVar70) {
                                  local_438[(int)uVar70].x0 = (float)uVar3;
                                  local_438[(int)uVar70].y0 = (float)uVar6;
                                  *(uchar **)&local_438[(int)uVar70].x1 = local_238[0].data;
                                  local_438[(int)uVar70].invert = iVar91;
                                }
                                uVar72 = uVar72 + 1;
                                lVar110 = lVar110 + 1;
                                psVar94 = psVar94 + 1;
                              } while (uVar72 != uVar98);
                            }
                            local_448 = (undefined1  [8])0x0;
                            scanline = local_238;
                            if (0x40 < (int)local_46c) {
                              scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_46c * 8 + 4);
                            }
                            local_438[(int)uVar98].y0 = (float)(iVar86 + iVar85) + 1.0;
                            if ((uint)local_3d0 < 0x7fffffff) {
                              local_2e8 = (long)(int)local_46c;
                              local_360 = (float *)((long)&scanline->data + local_2e8 * 4);
                              local_348 = (float)(int)local_428._0_4_;
                              local_320 = local_360 + 1;
                              local_2d8 = local_2e8 * 4;
                              local_2e0 = (long)((int)local_3d8 + 2) << 2;
                              local_3fc = (float)(int)local_46c;
                              local_378 = 0;
                              auVar78 = (undefined1  [8])0x0;
                              local_370 = 0;
                              local_3a8 = (undefined8 *)0x0;
                              local_3c0 = 0;
                              local_410 = (stbtt__active_edge *)0x0;
                              psVar94 = local_438;
                              do {
                                fVar92 = (float)iVar85;
                                fVar126 = fVar92 + 1.0;
                                memset(scanline,0,local_2d8);
                                memset(local_360,0,local_2e0);
                                if (auVar78 != (undefined1  [8])0x0) {
                                  psVar80 = (stbtt__active_edge *)local_448;
                                  do {
                                    if (((stbtt__active_edge *)auVar78)->ey <= fVar92) {
                                      psVar80->next = ((stbtt__active_edge *)auVar78)->next;
                                      if ((((stbtt__active_edge *)auVar78)->direction == 0.0) &&
                                         (!NAN(((stbtt__active_edge *)auVar78)->direction))) {
                                        __assert_fail("z->direction",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xd0b,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                      }
                                      ((stbtt__active_edge *)auVar78)->direction = 0.0;
                                      ((stbtt__active_edge *)auVar78)->next = local_410;
                                      local_410 = (stbtt__active_edge *)auVar78;
                                      auVar78 = (undefined1  [8])psVar80;
                                    }
                                    ppsVar59 = &((stbtt__active_edge *)auVar78)->next;
                                    psVar80 = (stbtt__active_edge *)auVar78;
                                    auVar78 = (undefined1  [8])*ppsVar59;
                                  } while (*ppsVar59 != (stbtt__active_edge *)0x0);
                                }
                                fVar154 = psVar94->y0;
                                if (fVar154 <= fVar126) {
                                  bVar60 = local_3c4 != 0;
                                  bVar111 = (int)local_370 == 0;
                                  do {
                                    psVar80 = local_410;
                                    fVar155 = psVar94->y1;
                                    if ((fVar154 != fVar155) || (NAN(fVar154) || NAN(fVar155))) {
                                      if (local_410 == (stbtt__active_edge *)0x0) {
                                        if (local_3c0 == 0) {
                                          puVar79 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                          if (puVar79 == (undefined8 *)0x0) {
                                            __assert_fail("z != __null",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xb32,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                          }
                                          *puVar79 = local_3a8;
                                          fVar154 = psVar94->y0;
                                          fVar155 = psVar94->y1;
                                          local_3c0 = 799;
                                        }
                                        else {
                                          local_3c0 = local_3c0 + -1;
                                          puVar79 = local_3a8;
                                        }
                                        local_3a8 = puVar79;
                                        psVar80 = (stbtt__active_edge *)
                                                  (puVar79 + (long)local_3c0 * 4 + 1);
                                        local_410 = (stbtt__active_edge *)0x0;
                                      }
                                      else {
                                        local_410 = local_410->next;
                                      }
                                      fVar156 = psVar94->x0;
                                      fVar157 = (psVar94->x1 - fVar156) / (fVar155 - fVar154);
                                      psVar80->fdx = fVar157;
                                      psVar80->fdy = (float)(-(uint)(fVar157 != 0.0) &
                                                            (uint)(1.0 / fVar157));
                                      psVar80->fx = ((fVar92 - fVar154) * fVar157 + fVar156) -
                                                    local_348;
                                      psVar80->direction =
                                           *(float *)(&DAT_001bd040 +
                                                     (ulong)(psVar94->invert == 0) * 4);
                                      psVar80->sy = fVar154;
                                      psVar80->ey = fVar155;
                                      psVar80->next = (stbtt__active_edge *)0x0;
                                      if (fVar155 < fVar92 && (bVar111 && bVar60)) {
                                        psVar80->ey = fVar92;
                                        fVar155 = fVar92;
                                      }
                                      if (fVar155 < fVar92) {
                                        __assert_fail("z->ey >= scan_y_top",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xd1e,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                      }
                                      psVar80->next = (stbtt__active_edge *)local_448;
                                      local_448 = (undefined1  [8])psVar80;
                                    }
                                    else {
                                    }
                                    fVar154 = psVar94[1].y0;
                                    psVar94 = psVar94 + 1;
                                  } while (fVar154 <= fVar126);
                                }
                                local_354 = iVar85;
                                auVar78 = local_448;
                                puVar79 = local_3a8;
                                for (e = local_448; local_448 = auVar78, local_3a8 = puVar79,
                                    e != (undefined1  [8])0x0;
                                    e = (undefined1  [8])((stbtt__active_edge *)e)->next) {
                                  fVar154 = ((stbtt__active_edge *)e)->ey;
                                  if (fVar154 < fVar92) {
                                    __assert_fail("e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc17,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar155 = ((stbtt__active_edge *)e)->fx;
                                  auVar151._0_8_ = CONCAT44(0,fVar155);
                                  auVar151._8_8_ = 0;
                                  fVar156 = ((stbtt__active_edge *)e)->fdx;
                                  if ((fVar156 != 0.0) || (NAN(fVar156))) {
                                    fVar157 = ((stbtt__active_edge *)e)->sy;
                                    if (fVar126 < fVar157) {
                                      __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc2a,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                    }
                                    fVar164 = fVar156 + fVar155;
                                    fVar162 = (float)(~-(uint)(fVar92 < fVar157) & (uint)fVar155 |
                                                     (uint)((fVar157 - fVar92) * fVar156 + fVar155)
                                                     & -(uint)(fVar92 < fVar157));
                                    if ((((fVar162 < 0.0) ||
                                         (fVar165 = (float)(~-(uint)(fVar154 < fVar126) &
                                                            (uint)fVar164 |
                                                           (uint)((fVar154 - fVar92) * fVar156 +
                                                                 fVar155) &
                                                           -(uint)(fVar154 < fVar126)),
                                         fVar165 < 0.0)) || (local_3fc <= fVar162)) ||
                                       (local_3fc <= fVar165)) {
                                      if ((uint)local_3d8 < 0x7fffffff) {
                                        local_3f8 = ZEXT416((uint)fVar164);
                                        local_338 = auVar151;
                                        local_248 = ZEXT416((uint)fVar156);
                                        uVar98 = 0;
                                        do {
                                          fVar155 = (float)(int)uVar98;
                                          uVar70 = uVar98 + 1;
                                          fVar162 = (float)(int)uVar70;
                                          fVar154 = local_338._0_4_;
                                          fVar157 = (fVar155 - fVar154) / local_248._0_4_ + fVar92;
                                          fVar156 = (fVar162 - fVar154) / local_248._0_4_ + fVar92;
                                          fVar164 = local_3f8._0_4_;
                                          if ((fVar155 <= fVar154) || (fVar164 <= fVar162)) {
                                            if ((fVar155 <= fVar164) || (fVar154 <= fVar162)) {
                                              fVar165 = fVar92;
                                              if (((fVar155 <= fVar154) || (fVar164 <= fVar155)) &&
                                                 ((fVar155 <= fVar164 || (fVar154 <= fVar155)))) {
                                                fVar157 = fVar92;
                                                if (((fVar154 < fVar162) && (fVar162 < fVar164)) ||
                                                   ((fVar155 = fVar154, fVar164 < fVar162 &&
                                                    (fVar162 < fVar154)))) {
                                                  local_428._0_4_ = fVar156;
                                                  goto LAB_0016bf2d;
                                                }
                                                goto LAB_0016bfea;
                                              }
                                            }
                                            else {
                                              local_428._0_4_ = fVar156;
                                              stbtt__handle_clipped_edge
                                                        ((float *)scanline,uVar98,
                                                         (stbtt__active_edge *)e,fVar154,fVar92,
                                                         fVar162,fVar156);
                                              fVar154 = fVar162;
                                              fVar165 = (float)local_428._0_4_;
                                            }
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar98,
                                                       (stbtt__active_edge *)e,fVar154,fVar165,
                                                       fVar155,fVar157);
                                          }
                                          else {
                                            local_428._0_4_ = fVar156;
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar98,
                                                       (stbtt__active_edge *)e,fVar154,fVar92,
                                                       fVar155,fVar157);
                                            fVar154 = fVar155;
                                            fVar156 = (float)local_428._0_4_;
LAB_0016bf2d:
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar98,
                                                       (stbtt__active_edge *)e,fVar154,fVar157,
                                                       fVar162,fVar156);
                                            fVar155 = fVar162;
                                            fVar157 = (float)local_428._0_4_;
                                          }
LAB_0016bfea:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar98,
                                                     (stbtt__active_edge *)e,fVar155,fVar157,
                                                     local_3f8._0_4_,fVar126);
                                          uVar98 = uVar70;
                                        } while (local_46c != uVar70);
                                      }
                                    }
                                    else {
                                      if (fVar157 <= fVar92) {
                                        fVar157 = fVar92;
                                      }
                                      uVar98 = (uint)fVar162;
                                      uVar72 = (ulong)uVar98;
                                      if (fVar126 <= fVar154) {
                                        fVar154 = fVar126;
                                      }
                                      if (uVar98 == (int)fVar165) {
                                        if (((int)uVar98 < 0) || ((int)local_46c <= (int)uVar98)) {
                                          __assert_fail("x >= 0 && x < len",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc46,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        fVar164 = (fVar154 - fVar157) *
                                                  ((stbtt__active_edge *)e)->direction;
                                        fVar154 = stbtt__position_trapezoid_area
                                                            (fVar164,fVar162,
                                                             (float)(int)uVar98 + 1.0,fVar165,
                                                             (float)(int)uVar98 + 1.0);
                                        *(float *)((long)&scanline->data + uVar72 * 4) =
                                             fVar154 + *(float *)((long)&scanline->data + uVar72 * 4
                                                                 );
                                      }
                                      else {
                                        fVar166 = ((stbtt__active_edge *)e)->fdy;
                                        fVar174 = fVar162;
                                        if (fVar165 < fVar162) {
                                          fVar155 = fVar92 - fVar157;
                                          fVar157 = (fVar92 - fVar154) + fVar126;
                                          fVar156 = -fVar156;
                                          fVar166 = -fVar166;
                                          fVar154 = fVar155 + fVar126;
                                          fVar155 = fVar164;
                                          fVar174 = fVar165;
                                          fVar165 = fVar162;
                                        }
                                        if (fVar166 < 0.0) {
                                          __assert_fail("dy >= 0",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc58,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        if (fVar156 < 0.0) {
                                          __assert_fail("dx >= 0",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc59,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        uVar98 = (uint)fVar174;
                                        iVar91 = (int)fVar165;
                                        iVar85 = uVar98 + 1;
                                        fVar164 = ((float)iVar85 - fVar155) * fVar166 + fVar92;
                                        fVar162 = (float)(int)fVar165;
                                        fVar156 = fVar126;
                                        if (fVar164 <= fVar126) {
                                          fVar156 = fVar164;
                                        }
                                        fVar164 = ((stbtt__active_edge *)e)->direction;
                                        fVar175 = (fVar156 - fVar157) * fVar164;
                                        auVar201 = ZEXT416((uint)fVar175);
                                        fVar155 = (fVar162 - fVar155) * fVar166 + fVar92;
                                        *(float *)((long)&scanline->data + (long)(int)uVar98 * 4) =
                                             ((float)iVar85 - fVar174) * fVar175 * 0.5 +
                                             *(float *)((long)&scanline->data +
                                                       (long)(int)uVar98 * 4);
                                        if ((fVar126 < fVar155) &&
                                           (fVar155 = fVar126, iVar91 - iVar85 != 0)) {
                                          fVar166 = (fVar126 - fVar156) / (float)(iVar91 - iVar85);
                                        }
                                        if (iVar85 < iVar91) {
                                          lVar110 = 0;
                                          do {
                                            *(float *)((long)&scanline->data +
                                                      (iVar85 + lVar110) * 4) =
                                                 fVar166 * fVar164 * 0.5 + auVar201._0_4_ +
                                                 *(float *)((long)&scanline->data +
                                                           (iVar85 + lVar110) * 4);
                                            auVar201._0_4_ = auVar201._0_4_ + fVar166 * fVar164;
                                            lVar110 = lVar110 + 1;
                                          } while (~uVar98 + iVar91 != (int)lVar110);
                                        }
                                        if (1.01 < ABS(auVar201._0_4_)) {
                                          __assert_fail("fabsf(area) <= 1.01f",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc9c,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        local_428 = auVar201;
                                        if (fVar154 <= fVar155 + -0.01) {
                                          __assert_fail("sy1 > y_final-0.01f",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                                  ,0xc9d,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        fVar155 = stbtt__position_trapezoid_area
                                                            (fVar154 - fVar155,fVar162,fVar162 + 1.0
                                                             ,fVar165,fVar162 + 1.0);
                                        uVar72 = (ulong)iVar91;
                                        *(float *)((long)&scanline->data + uVar72 * 4) =
                                             fVar155 * fVar164 + (float)local_428._0_4_ +
                                             *(float *)((long)&scanline->data + uVar72 * 4);
                                        fVar164 = (fVar154 - fVar157) * fVar164;
                                      }
                                      local_320[uVar72] = fVar164 + local_320[uVar72];
                                    }
                                  }
                                  else if (fVar155 < local_3fc) {
                                    if (0.0 <= fVar155) {
                                      local_338 = auVar151;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,(int)fVar155,
                                                 (stbtt__active_edge *)e,fVar155,fVar92,fVar155,
                                                 fVar126);
                                      iVar85 = (int)fVar155 + 1;
                                      auVar132 = local_338;
                                    }
                                    else {
                                      iVar85 = 0;
                                      auVar132._8_8_ = 0;
                                      auVar132._0_8_ = auVar151._0_8_;
                                    }
                                    stbtt__handle_clipped_edge
                                              (local_360,iVar85,(stbtt__active_edge *)e,
                                               auVar132._0_4_,fVar92,auVar132._0_4_,fVar126);
                                  }
                                  auVar78 = local_448;
                                  puVar79 = local_3a8;
                                }
                                uVar98 = (uint)DAT_0019d110;
                                psVar80 = (stbtt__active_edge *)auVar78;
                                if ((uint)local_3d8 < 0x7fffffff) {
                                  fVar126 = 0.0;
                                  psVar81 = scanline;
                                  uVar72 = local_378;
                                  lVar110 = local_2e8;
                                  do {
                                    fVar126 = fVar126 + *(float *)((long)&psVar81->data +
                                                                  local_2e8 * 4);
                                    iVar85 = (int)((float)((uint)(*(float *)&psVar81->data + fVar126
                                                                 ) & uVar98) * 255.0 + 0.5);
                                    if (0xfe < iVar85) {
                                      iVar85 = 0xff;
                                    }
                                    local_2d0[(int)uVar72] = (uchar)iVar85;
                                    uVar72 = (ulong)((int)uVar72 + 1);
                                    psVar81 = (stbtt__buf *)((long)&psVar81->data + 4);
                                    lVar110 = lVar110 + -1;
                                  } while (lVar110 != 0);
                                }
                                for (; psVar80 != (stbtt__active_edge *)0x0; psVar80 = psVar80->next
                                    ) {
                                  psVar80->fx = psVar80->fdx + psVar80->fx;
                                }
                                iVar85 = local_354 + 1;
                                iVar91 = (int)local_370;
                                local_370 = (ulong)(iVar91 + 1);
                                local_378 = (ulong)(uint)((int)local_378 + (int)local_42c);
                              } while (iVar91 != (uint)local_3d0);
                              while (puVar79 != (undefined8 *)0x0) {
                                puVar15 = (undefined8 *)*puVar79;
                                ImGui::MemFree(puVar79);
                                puVar79 = puVar15;
                              }
                            }
                            ptr_00 = local_450;
                            if (scanline != local_238) {
                              ImGui::MemFree(scanline);
                            }
                            ImGui::MemFree(local_438);
                          }
                          ImGui::MemFree(local_418);
                          ImGui::MemFree(ptr_00);
                        }
                      }
                    }
                  }
                }
LAB_0016c44e:
                ImGui::MemFree((void *)CONCAT44(local_408._4_4_,(stbtt_uint32)local_408));
                iVar85 = *(int *)(local_3a0 + 0xc);
                iVar91 = *(int *)(local_3a0 + 0x10);
                uVar169 = *(undefined8 *)(local_3a0 + 4);
                auVar127 = _DAT_001bcf60;
                if ((byte)local_300 < 2) {
                  iVar71 = (int)local_458;
                  fVar126 = (float)local_468._0_4_;
                  pIVar107 = atlas_00;
                }
                else {
                  local_238[0].data = (uchar *)0x0;
                  iVar71 = (int)((ulong)uVar169 >> 0x20);
                  if (0 < iVar71) {
                    puVar77 = local_380 + (long)(iVar91 * (int)local_42c) + (long)iVar85;
                    iVar91 = (int)uVar169;
                    iVar85 = iVar91 - local_488._0_4_;
                    uVar98 = (int)local_2c8 + iVar91 + 1;
                    uVar72 = (ulong)uVar98;
                    iVar86 = 0;
                    do {
                      uVar87 = local_300;
                      memset(local_238,0,local_300);
                      auVar127 = _DAT_001bcf60;
                      uVar167 = local_488._0_4_;
                      uVar70 = uVar98;
                      switch((int)uVar87) {
                      case 2:
                        if (iVar85 < 0) {
LAB_0016c75c:
                          uVar87 = 0;
                          uVar70 = 0;
                        }
                        else {
                          uVar103 = 0;
                          uVar87 = 0;
                          do {
                            bVar112 = puVar77[uVar103];
                            bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 & 7))
                            ;
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 + 2 & 7)) =
                                 bVar112;
                            uVar130 = (int)uVar87 + ((uint)bVar112 - (uint)bVar7);
                            uVar87 = (ulong)uVar130;
                            puVar77[uVar103] = (uchar)(uVar130 >> 1);
                            uVar103 = uVar103 + 1;
                          } while (uVar72 != uVar103);
                        }
                        break;
                      case 3:
                        if (iVar85 < 0) goto LAB_0016c75c;
                        uVar103 = 0;
                        uVar87 = 0;
                        do {
                          bVar112 = puVar77[uVar103];
                          bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 + 3 & 7)) =
                               bVar112;
                          uVar87 = (ulong)((int)uVar87 + ((uint)bVar112 - (uint)bVar7));
                          puVar77[uVar103] = (uchar)(uVar87 / 3);
                          uVar103 = uVar103 + 1;
                        } while (uVar72 != uVar103);
                        break;
                      case 4:
                        if (iVar85 < 0) goto LAB_0016c75c;
                        uVar103 = 0;
                        uVar87 = 0;
                        do {
                          bVar112 = puVar77[uVar103];
                          uVar95 = (ulong)((uint)uVar103 & 7);
                          bVar7 = *(byte *)((long)&local_238[0].data + uVar95);
                          *(byte *)((long)&local_238[0].data + (uVar95 ^ 4)) = bVar112;
                          uVar130 = (int)uVar87 + ((uint)bVar112 - (uint)bVar7);
                          uVar87 = (ulong)uVar130;
                          puVar77[uVar103] = (uchar)(uVar130 >> 2);
                          uVar103 = uVar103 + 1;
                        } while (uVar72 != uVar103);
                        break;
                      case 5:
                        if (iVar85 < 0) goto LAB_0016c75c;
                        uVar103 = 0;
                        uVar87 = 0;
                        do {
                          bVar112 = puVar77[uVar103];
                          bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 + 5 & 7)) =
                               bVar112;
                          uVar87 = (ulong)((int)uVar87 + ((uint)bVar112 - (uint)bVar7));
                          puVar77[uVar103] = (uchar)(uVar87 / 5);
                          uVar103 = uVar103 + 1;
                        } while (uVar72 != uVar103);
                        break;
                      default:
                        if (iVar85 < 0) {
                          uVar87 = 0;
                          uVar70 = 0;
                        }
                        else {
                          uVar103 = 0;
                          uVar87 = 0;
                          do {
                            bVar112 = puVar77[uVar103];
                            bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 & 7))
                            ;
                            *(byte *)((long)&local_238[0].data +
                                     (ulong)(uVar167 + (uint)uVar103 & 7)) = bVar112;
                            uVar87 = (ulong)((int)uVar87 + ((uint)bVar112 - (uint)bVar7));
                            puVar77[uVar103] = (uchar)(uVar87 / ((ulong)local_488 & 0xffffffff));
                            uVar103 = uVar103 + 1;
                          } while (uVar72 != uVar103);
                        }
                      }
                      if ((int)uVar70 < iVar91) {
                        uVar103 = (ulong)uVar70;
                        do {
                          if (puVar77[uVar103] != '\0') {
                            __assert_fail("pixels[i] == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                          ,0xfe9,
                                          "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                         );
                          }
                          uVar70 = (int)uVar87 -
                                   (uint)*(byte *)((long)&local_238[0].data +
                                                  (ulong)((uint)uVar103 & 7));
                          uVar87 = (ulong)uVar70;
                          puVar77[uVar103] = (uchar)(uVar70 / (uint)uVar167);
                          uVar103 = uVar103 + 1;
                        } while ((int)uVar103 < iVar91);
                      }
                      puVar77 = puVar77 + lVar99;
                      iVar86 = iVar86 + 1;
                    } while (iVar86 != iVar71);
                    iVar85 = *(int *)(local_3a0 + 0xc);
                    iVar91 = *(int *)(local_3a0 + 0x10);
                    uVar169 = *(undefined8 *)(local_3a0 + 4);
                  }
                  iVar71 = (int)local_458;
                  fVar126 = (float)local_468._0_4_;
                  pIVar107 = atlas_00;
                }
                if ((byte)local_308 < 2) {
LAB_0016cd27:
                  uVar61 = (ushort)local_400;
                }
                else {
                  local_238[0].data = (uchar *)0x0;
                  if ((int)uVar169 < 1) goto LAB_0016cd27;
                  pbVar106 = local_380 + (long)(iVar91 * (int)local_42c) + (long)iVar85;
                  iVar91 = (int)((ulong)uVar169 >> 0x20);
                  iVar71 = iVar91 - iVar71;
                  uVar98 = iVar91 + (int)local_318 + 1;
                  uVar72 = (ulong)uVar98;
                  iVar85 = 0;
                  do {
                    uVar87 = local_308;
                    memset(local_238,0,local_308);
                    auVar127 = _DAT_001bcf60;
                    uVar70 = uVar98;
                    switch((int)uVar87) {
                    case 2:
                      if (iVar71 < 0) {
LAB_0016cbf0:
                        uVar87 = 0;
                        uVar70 = 0;
                      }
                      else {
                        uVar103 = 0;
                        uVar87 = 0;
                        pbVar97 = pbVar106;
                        do {
                          bVar112 = *pbVar97;
                          bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 + 2 & 7)) =
                               bVar112;
                          uVar130 = (int)uVar87 + ((uint)bVar112 - (uint)bVar7);
                          uVar87 = (ulong)uVar130;
                          *pbVar97 = (byte)(uVar130 >> 1);
                          uVar103 = uVar103 + 1;
                          pbVar97 = pbVar97 + lVar99;
                        } while (uVar72 != uVar103);
                      }
                      break;
                    case 3:
                      if (iVar71 < 0) goto LAB_0016cbf0;
                      uVar103 = 0;
                      uVar87 = 0;
                      pbVar97 = pbVar106;
                      do {
                        bVar112 = *pbVar97;
                        bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 + 3 & 7)) =
                             bVar112;
                        uVar87 = (ulong)((int)uVar87 + ((uint)bVar112 - (uint)bVar7));
                        *pbVar97 = (byte)(uVar87 / 3);
                        uVar103 = uVar103 + 1;
                        pbVar97 = pbVar97 + lVar99;
                      } while (uVar72 != uVar103);
                      break;
                    case 4:
                      if (iVar71 < 0) goto LAB_0016cbf0;
                      uVar103 = 0;
                      uVar87 = 0;
                      pbVar97 = pbVar106;
                      do {
                        bVar112 = *pbVar97;
                        uVar95 = (ulong)((uint)uVar103 & 7);
                        bVar7 = *(byte *)((long)&local_238[0].data + uVar95);
                        *(byte *)((long)&local_238[0].data + (uVar95 ^ 4)) = bVar112;
                        uVar130 = (int)uVar87 + ((uint)bVar112 - (uint)bVar7);
                        uVar87 = (ulong)uVar130;
                        *pbVar97 = (byte)(uVar130 >> 2);
                        uVar103 = uVar103 + 1;
                        pbVar97 = pbVar97 + lVar99;
                      } while (uVar72 != uVar103);
                      break;
                    case 5:
                      if (iVar71 < 0) goto LAB_0016cbf0;
                      uVar103 = 0;
                      uVar87 = 0;
                      pbVar97 = pbVar106;
                      do {
                        bVar112 = *pbVar97;
                        bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 + 5 & 7)) =
                             bVar112;
                        uVar87 = (ulong)((int)uVar87 + ((uint)bVar112 - (uint)bVar7));
                        *pbVar97 = (byte)(uVar87 / 5);
                        uVar103 = uVar103 + 1;
                        pbVar97 = pbVar97 + lVar99;
                      } while (uVar72 != uVar103);
                      break;
                    default:
                      if (iVar71 < 0) {
                        uVar87 = 0;
                        uVar70 = 0;
                      }
                      else {
                        uVar103 = 0;
                        uVar87 = 0;
                        pbVar97 = pbVar106;
                        do {
                          bVar112 = *pbVar97;
                          bVar7 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar103 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((int)local_458 + (uint)uVar103 & 7)) = bVar112;
                          uVar87 = (ulong)((int)uVar87 + ((uint)bVar112 - (uint)bVar7));
                          *pbVar97 = (byte)(uVar87 / (local_458 & 0xffffffff));
                          uVar103 = uVar103 + 1;
                          pbVar97 = pbVar97 + lVar99;
                        } while (uVar72 != uVar103);
                      }
                    }
                    iVar86 = iVar91 - uVar70;
                    if (iVar86 != 0 && (int)uVar70 <= iVar91) {
                      lVar110 = (long)(int)uVar70;
                      pbVar97 = pbVar106 + lVar99 * lVar110;
                      do {
                        if (*pbVar97 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                                        ,0x1027,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar87 = (ulong)((int)uVar87 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)lVar110 & 7)));
                        *pbVar97 = (byte)(uVar87 / (local_458 & 0xffffffff));
                        lVar110 = lVar110 + 1;
                        pbVar97 = pbVar97 + lVar99;
                        iVar86 = iVar86 + -1;
                      } while (iVar86 != 0);
                    }
                    pbVar106 = pbVar106 + 1;
                    iVar85 = iVar85 + 1;
                  } while (iVar85 != (int)uVar169);
                  iVar85 = *(int *)(local_3a0 + 0xc);
                  iVar91 = *(int *)(local_3a0 + 0x10);
                  uVar169 = *(undefined8 *)(local_3a0 + 4);
                  uVar61 = (ushort)local_400;
                  fVar126 = (float)local_468._0_4_;
                }
                *local_2c0 = (short)iVar85;
                local_2c0[1] = (short)iVar91;
                local_2c0[2] = (short)uVar169 + (short)iVar85;
                local_2c0[3] = (short)((ulong)uVar169 >> 0x20) + (short)iVar91;
                *(float *)(local_2c0 + 8) =
                     (float)(int)(short)((ushort)(local_350 << 8) | uVar61) * fVar126;
                *(ulong *)(local_2c0 + 4) =
                     CONCAT44((float)local_344 * local_278._4_4_ + local_268._4_4_,
                              (float)local_340 * local_278._0_4_ + local_268._0_4_);
                *(float *)(local_2c0 + 10) =
                     (float)(local_340 + (int)uVar169) * local_278._0_4_ + local_268._0_4_;
                *(float *)(local_2c0 + 0xc) =
                     (float)(local_344 + (int)((ulong)uVar169 >> 0x20)) * local_278._4_4_ +
                     local_268._4_4_;
                lVar88 = local_2b8;
                lVar110 = local_368;
                psVar89 = local_3b0;
                auVar139 = local_268;
                uVar98 = local_34c;
                atlas_00 = pIVar107;
                if ((int)local_310 == 0) {
                  uVar98 = (uint)local_2b8;
                }
              }
            }
            lVar88 = lVar88 + 1;
          } while (lVar88 < psVar89[1].fontstart);
        }
        fVar126 = local_2f0[local_3b8].RasterizerMultiply;
        _local_488 = ZEXT416((uint)fVar126);
        if ((fVar126 != 1.0) || (NAN(fVar126))) {
          local_488._4_4_ = fVar126;
          local_488._0_4_ = fVar126;
          uStack_480._0_4_ = fVar126;
          uStack_480._4_4_ = fVar126;
          lVar110 = 0;
          uVar98 = 0;
          uVar70 = 1;
          uVar130 = 2;
          uVar101 = 3;
          uVar143 = 0xc;
          uVar144 = 0xd;
          uVar145 = 0xe;
          uVar146 = 0xf;
          auVar133 = _DAT_001bcee0;
          auVar140 = _DAT_001bced0;
          do {
            uVar131 = auVar133._0_4_;
            uVar135 = auVar133._4_4_;
            uVar136 = auVar133._12_4_;
            uVar163 = auVar133._8_4_;
            uVar137 = auVar140._0_4_;
            uVar141 = auVar140._4_4_;
            uVar142 = auVar140._12_4_;
            uVar194 = auVar140._8_4_;
            fVar177 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar137 & 0xffff | 0x4b000000)) * fVar126;
            fVar181 = (((float)(uVar141 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar141 & 0xffff | 0x4b000000)) * fVar126;
            fVar182 = (((float)(uVar194 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar194 & 0xffff | 0x4b000000)) * fVar126;
            fVar183 = (((float)(uVar142 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar142 & 0xffff | 0x4b000000)) * fVar126;
            fVar166 = (((float)(uVar143 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar143 & 0xffff | 0x4b000000)) * fVar126;
            fVar174 = (((float)(uVar144 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar144 & 0xffff | 0x4b000000)) * fVar126;
            fVar175 = (((float)(uVar145 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar145 & 0xffff | 0x4b000000)) * fVar126;
            fVar176 = (((float)(uVar146 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar146 & 0xffff | 0x4b000000)) * fVar126;
            fVar157 = (((float)(uVar98 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar98 & 0xffff | 0x4b000000)) * fVar126;
            fVar162 = (((float)(uVar70 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar70 & 0xffff | 0x4b000000)) * fVar126;
            fVar164 = (((float)(uVar130 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar130 & 0xffff | 0x4b000000)) * fVar126;
            fVar165 = (((float)(uVar101 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar101 & 0xffff | 0x4b000000)) * fVar126;
            fVar92 = (((float)(uVar131 >> 0x10 | 0x53000000) - 5.497642e+11) +
                     (float)(uVar131 & 0xffff | 0x4b000000)) * fVar126;
            fVar154 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar135 & 0xffff | 0x4b000000)) * fVar126;
            fVar155 = (((float)(uVar163 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar163 & 0xffff | 0x4b000000)) * fVar126;
            fVar156 = (((float)(uVar136 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar136 & 0xffff | 0x4b000000)) * fVar126;
            auVar153._0_4_ = (int)fVar92;
            auVar153._4_4_ = (int)fVar154;
            auVar153._8_4_ = (int)fVar155;
            auVar153._12_4_ = (int)fVar156;
            auVar195._0_4_ = auVar153._0_4_ >> 0x1f;
            auVar195._4_4_ = auVar153._4_4_ >> 0x1f;
            auVar195._8_4_ = auVar153._8_4_ >> 0x1f;
            auVar195._12_4_ = auVar153._12_4_ >> 0x1f;
            auVar152._0_4_ = (int)(fVar92 - 2.1474836e+09);
            auVar152._4_4_ = (int)(fVar154 - 2.1474836e+09);
            auVar152._8_4_ = (int)(fVar155 - 2.1474836e+09);
            auVar152._12_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar153 = auVar152 & auVar195 | auVar153;
            auVar161._0_4_ = (int)fVar157;
            auVar161._4_4_ = (int)fVar162;
            auVar161._8_4_ = (int)fVar164;
            auVar161._12_4_ = (int)fVar165;
            auVar196._0_4_ = auVar161._0_4_ >> 0x1f;
            auVar196._4_4_ = auVar161._4_4_ >> 0x1f;
            auVar196._8_4_ = auVar161._8_4_ >> 0x1f;
            auVar196._12_4_ = auVar161._12_4_ >> 0x1f;
            auVar160._0_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar160._4_4_ = (int)(fVar162 - 2.1474836e+09);
            auVar160._8_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar160._12_4_ = (int)(fVar165 - 2.1474836e+09);
            auVar161 = auVar160 & auVar196 | auVar161;
            auVar190._0_4_ = (int)fVar166;
            auVar190._4_4_ = (int)fVar174;
            auVar190._8_4_ = (int)fVar175;
            auVar190._12_4_ = (int)fVar176;
            auVar200._0_4_ = auVar190._0_4_ >> 0x1f;
            auVar200._4_4_ = auVar190._4_4_ >> 0x1f;
            auVar200._8_4_ = auVar190._8_4_ >> 0x1f;
            auVar200._12_4_ = auVar190._12_4_ >> 0x1f;
            auVar189._0_4_ = (int)(fVar166 - 2.1474836e+09);
            auVar189._4_4_ = (int)(fVar174 - 2.1474836e+09);
            auVar189._8_4_ = (int)(fVar175 - 2.1474836e+09);
            auVar189._12_4_ = (int)(fVar176 - 2.1474836e+09);
            auVar190 = auVar189 & auVar200 | auVar190;
            auVar179._0_4_ = (int)fVar177;
            auVar179._4_4_ = (int)fVar181;
            auVar179._8_4_ = (int)fVar182;
            auVar179._12_4_ = (int)fVar183;
            auVar197._0_4_ = auVar179._0_4_ >> 0x1f;
            auVar197._4_4_ = auVar179._4_4_ >> 0x1f;
            auVar197._8_4_ = auVar179._8_4_ >> 0x1f;
            auVar197._12_4_ = auVar179._12_4_ >> 0x1f;
            auVar178._0_4_ = (int)(fVar177 - 2.1474836e+09);
            auVar178._4_4_ = (int)(fVar181 - 2.1474836e+09);
            auVar178._8_4_ = (int)(fVar182 - 2.1474836e+09);
            auVar178._12_4_ = (int)(fVar183 - 2.1474836e+09);
            auVar179 = auVar178 & auVar197 | auVar179;
            auVar198 = auVar179 ^ _DAT_001a6970;
            auVar172._0_4_ = -(uint)(auVar198._0_4_ < -0x7fffff01);
            auVar172._4_4_ = -(uint)(auVar198._4_4_ < -0x7fffff01);
            auVar172._8_4_ = -(uint)(auVar198._8_4_ < -0x7fffff01);
            auVar172._12_4_ = -(uint)(auVar198._12_4_ < -0x7fffff01);
            auVar198 = ~auVar172 & auVar127 | auVar179 & auVar172;
            auVar129 = auVar190 ^ _DAT_001a6970;
            auVar199._0_4_ = -(uint)(auVar129._0_4_ < -0x7fffff01);
            auVar199._4_4_ = -(uint)(auVar129._4_4_ < -0x7fffff01);
            auVar199._8_4_ = -(uint)(auVar129._8_4_ < -0x7fffff01);
            auVar199._12_4_ = -(uint)(auVar129._12_4_ < -0x7fffff01);
            auVar129 = ~auVar199 & auVar127 | auVar190 & auVar199;
            sVar113 = auVar198._0_2_;
            cVar18 = (0 < sVar113) * (sVar113 < 0x100) * auVar198[0] - (0xff < sVar113);
            sVar113 = auVar198._2_2_;
            sVar121 = CONCAT11((0 < sVar113) * (sVar113 < 0x100) * auVar198[2] - (0xff < sVar113),
                               cVar18);
            sVar113 = auVar198._4_2_;
            cVar118 = (0 < sVar113) * (sVar113 < 0x100) * auVar198[4] - (0xff < sVar113);
            sVar113 = auVar198._6_2_;
            uVar167 = CONCAT13((0 < sVar113) * (sVar113 < 0x100) * auVar198[6] - (0xff < sVar113),
                               CONCAT12(cVar118,sVar121));
            sVar113 = auVar198._8_2_;
            cVar19 = (0 < sVar113) * (sVar113 < 0x100) * auVar198[8] - (0xff < sVar113);
            sVar113 = auVar198._10_2_;
            uVar168 = CONCAT15((0 < sVar113) * (sVar113 < 0x100) * auVar198[10] - (0xff < sVar113),
                               CONCAT14(cVar19,uVar167));
            sVar113 = auVar198._12_2_;
            cVar20 = (0 < sVar113) * (sVar113 < 0x100) * auVar198[0xc] - (0xff < sVar113);
            sVar113 = auVar198._14_2_;
            uVar169 = CONCAT17((0 < sVar113) * (sVar113 < 0x100) * auVar198[0xe] - (0xff < sVar113),
                               CONCAT16(cVar20,uVar168));
            sVar113 = auVar129._0_2_;
            cVar21 = (0 < sVar113) * (sVar113 < 0x100) * auVar129[0] - (0xff < sVar113);
            sVar113 = auVar129._2_2_;
            auVar170._0_10_ =
                 CONCAT19((0 < sVar113) * (sVar113 < 0x100) * auVar129[2] - (0xff < sVar113),
                          CONCAT18(cVar21,uVar169));
            sVar113 = auVar129._4_2_;
            cVar22 = (0 < sVar113) * (sVar113 < 0x100) * auVar129[4] - (0xff < sVar113);
            auVar170[10] = cVar22;
            sVar113 = auVar129._6_2_;
            auVar170[0xb] = (0 < sVar113) * (sVar113 < 0x100) * auVar129[6] - (0xff < sVar113);
            sVar113 = auVar129._8_2_;
            cVar122 = (0 < sVar113) * (sVar113 < 0x100) * auVar129[8] - (0xff < sVar113);
            auVar171[0xc] = cVar122;
            auVar171._0_12_ = auVar170;
            sVar113 = auVar129._10_2_;
            auVar171[0xd] = (0 < sVar113) * (sVar113 < 0x100) * auVar129[10] - (0xff < sVar113);
            sVar113 = auVar129._12_2_;
            cVar119 = (0 < sVar113) * (sVar113 < 0x100) * auVar129[0xc] - (0xff < sVar113);
            auVar173[0xe] = cVar119;
            auVar173._0_14_ = auVar171;
            sVar113 = auVar129._14_2_;
            auVar173[0xf] = (0 < sVar113) * (sVar113 < 0x100) * auVar129[0xe] - (0xff < sVar113);
            auVar198 = auVar161 ^ _DAT_001a6970;
            auVar191._0_4_ = -(uint)(auVar198._0_4_ < -0x7fffff01);
            auVar191._4_4_ = -(uint)(auVar198._4_4_ < -0x7fffff01);
            auVar191._8_4_ = -(uint)(auVar198._8_4_ < -0x7fffff01);
            auVar191._12_4_ = -(uint)(auVar198._12_4_ < -0x7fffff01);
            auVar129 = ~auVar191 & auVar127 | auVar161 & auVar191;
            auVar198 = auVar153 ^ _DAT_001a6970;
            auVar180._0_4_ = -(uint)(auVar198._0_4_ < -0x7fffff01);
            auVar180._4_4_ = -(uint)(auVar198._4_4_ < -0x7fffff01);
            auVar180._8_4_ = -(uint)(auVar198._8_4_ < -0x7fffff01);
            auVar180._12_4_ = -(uint)(auVar198._12_4_ < -0x7fffff01);
            auVar198 = ~auVar180 & auVar127 | auVar153 & auVar180;
            sVar113 = auVar129._0_2_;
            cVar23 = (0 < sVar113) * (sVar113 < 0x100) * auVar129[0] - (0xff < sVar113);
            sVar113 = auVar129._2_2_;
            sVar123 = CONCAT11((0 < sVar113) * (sVar113 < 0x100) * auVar129[2] - (0xff < sVar113),
                               cVar23);
            sVar113 = auVar129._4_2_;
            cVar24 = (0 < sVar113) * (sVar113 < 0x100) * auVar129[4] - (0xff < sVar113);
            sVar113 = auVar129._6_2_;
            uVar184 = CONCAT13((0 < sVar113) * (sVar113 < 0x100) * auVar129[6] - (0xff < sVar113),
                               CONCAT12(cVar24,sVar123));
            sVar113 = auVar129._8_2_;
            cVar25 = (0 < sVar113) * (sVar113 < 0x100) * auVar129[8] - (0xff < sVar113);
            sVar113 = auVar129._10_2_;
            uVar185 = CONCAT15((0 < sVar113) * (sVar113 < 0x100) * auVar129[10] - (0xff < sVar113),
                               CONCAT14(cVar25,uVar184));
            sVar113 = auVar129._12_2_;
            cVar26 = (0 < sVar113) * (sVar113 < 0x100) * auVar129[0xc] - (0xff < sVar113);
            sVar113 = auVar129._14_2_;
            uVar186 = CONCAT17((0 < sVar113) * (sVar113 < 0x100) * auVar129[0xe] - (0xff < sVar113),
                               CONCAT16(cVar26,uVar185));
            sVar113 = auVar198._0_2_;
            cVar27 = (0 < sVar113) * (sVar113 < 0x100) * auVar198[0] - (0xff < sVar113);
            sVar113 = auVar198._2_2_;
            auVar187._0_10_ =
                 CONCAT19((0 < sVar113) * (sVar113 < 0x100) * auVar198[2] - (0xff < sVar113),
                          CONCAT18(cVar27,uVar186));
            sVar113 = auVar198._4_2_;
            cVar28 = (0 < sVar113) * (sVar113 < 0x100) * auVar198[4] - (0xff < sVar113);
            auVar187[10] = cVar28;
            sVar113 = auVar198._6_2_;
            auVar187[0xb] = (0 < sVar113) * (sVar113 < 0x100) * auVar198[6] - (0xff < sVar113);
            sVar113 = auVar198._8_2_;
            cVar29 = (0 < sVar113) * (sVar113 < 0x100) * auVar198[8] - (0xff < sVar113);
            auVar188[0xc] = cVar29;
            auVar188._0_12_ = auVar187;
            sVar113 = auVar198._10_2_;
            auVar188[0xd] = (0 < sVar113) * (sVar113 < 0x100) * auVar198[10] - (0xff < sVar113);
            sVar113 = auVar198._12_2_;
            cVar30 = (0 < sVar113) * (sVar113 < 0x100) * auVar198[0xc] - (0xff < sVar113);
            auVar192[0xe] = cVar30;
            auVar192._0_14_ = auVar188;
            sVar113 = auVar198._14_2_;
            auVar192[0xf] = (0 < sVar113) * (sVar113 < 0x100) * auVar198[0xe] - (0xff < sVar113);
            sVar113 = (short)((uint)uVar184 >> 0x10);
            auVar193[1] = (0 < sVar113) * (sVar113 < 0x100) * cVar24 - (0xff < sVar113);
            auVar193[0] = (0 < sVar123) * (sVar123 < 0x100) * cVar23 - (0xff < sVar123);
            sVar113 = (short)((uint6)uVar185 >> 0x20);
            auVar193[2] = (0 < sVar113) * (sVar113 < 0x100) * cVar25 - (0xff < sVar113);
            sVar113 = (short)((ulong)uVar186 >> 0x30);
            auVar193[3] = (0 < sVar113) * (sVar113 < 0x100) * cVar26 - (0xff < sVar113);
            sVar113 = (short)((unkuint10)auVar187._0_10_ >> 0x40);
            auVar193[4] = (0 < sVar113) * (sVar113 < 0x100) * cVar27 - (0xff < sVar113);
            sVar113 = auVar187._10_2_;
            auVar193[5] = (0 < sVar113) * (sVar113 < 0x100) * cVar28 - (0xff < sVar113);
            sVar113 = auVar188._12_2_;
            auVar193[6] = (0 < sVar113) * (sVar113 < 0x100) * cVar29 - (0xff < sVar113);
            sVar113 = auVar192._14_2_;
            auVar193[7] = (0 < sVar113) * (sVar113 < 0x100) * cVar30 - (0xff < sVar113);
            auVar193[8] = (0 < sVar121) * (sVar121 < 0x100) * cVar18 - (0xff < sVar121);
            sVar113 = (short)((uint)uVar167 >> 0x10);
            auVar193[9] = (0 < sVar113) * (sVar113 < 0x100) * cVar118 - (0xff < sVar113);
            sVar113 = (short)((uint6)uVar168 >> 0x20);
            auVar193[10] = (0 < sVar113) * (sVar113 < 0x100) * cVar19 - (0xff < sVar113);
            sVar113 = (short)((ulong)uVar169 >> 0x30);
            auVar193[0xb] = (0 < sVar113) * (sVar113 < 0x100) * cVar20 - (0xff < sVar113);
            sVar113 = (short)((unkuint10)auVar170._0_10_ >> 0x40);
            auVar193[0xc] = (0 < sVar113) * (sVar113 < 0x100) * cVar21 - (0xff < sVar113);
            sVar113 = auVar170._10_2_;
            auVar193[0xd] = (0 < sVar113) * (sVar113 < 0x100) * cVar22 - (0xff < sVar113);
            sVar113 = auVar171._12_2_;
            auVar193[0xe] = (0 < sVar113) * (sVar113 < 0x100) * cVar122 - (0xff < sVar113);
            sVar113 = auVar173._14_2_;
            auVar193[0xf] = (0 < sVar113) * (sVar113 < 0x100) * cVar119 - (0xff < sVar113);
            *(undefined1 (*) [16])((long)&local_238[0].data + lVar110) = auVar193;
            lVar110 = lVar110 + 0x10;
            iVar85 = (int)DAT_001bcf70;
            uVar98 = uVar98 + iVar85;
            iVar91 = DAT_001bcf70._4_4_;
            uVar70 = uVar70 + iVar91;
            iVar71 = DAT_001bcf70._8_4_;
            uVar130 = uVar130 + iVar71;
            iVar86 = DAT_001bcf70._12_4_;
            uVar101 = uVar101 + iVar86;
            auVar133._0_4_ = uVar131 + iVar85;
            auVar133._4_4_ = uVar135 + iVar91;
            auVar133._8_4_ = uVar163 + iVar71;
            auVar133._12_4_ = uVar136 + iVar86;
            auVar140._0_4_ = uVar137 + iVar85;
            auVar140._4_4_ = uVar141 + iVar91;
            auVar140._8_4_ = uVar194 + iVar71;
            auVar140._12_4_ = uVar142 + iVar86;
            uVar143 = uVar143 + iVar85;
            uVar144 = uVar144 + iVar91;
            uVar145 = uVar145 + iVar71;
            uVar146 = uVar146 + iVar86;
          } while (lVar110 != 0x100);
          iVar85 = psVar89[1].cff.cursor;
          if (0 < iVar85) {
            lVar88._0_4_ = psVar89[1].hmtx;
            lVar88._4_4_ = psVar89[1].kern;
            iVar91 = 0;
            do {
              if ((*(int *)(lVar88 + 0x14) != 0) && (0 < *(int *)(lVar88 + 8))) {
                iVar85 = pIVar107->TexWidth;
                uVar98 = *(uint *)(lVar88 + 4);
                puVar77 = pIVar107->TexPixelsAlpha8 +
                          (long)*(int *)(lVar88 + 0x10) * (long)iVar85 +
                          (long)*(int *)(lVar88 + 0xc);
                iVar71 = *(int *)(lVar88 + 8);
                do {
                  if (0 < (int)uVar98) {
                    uVar72 = 0;
                    do {
                      puVar77[uVar72] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar77[uVar72]);
                      uVar72 = uVar72 + 1;
                    } while (uVar98 != uVar72);
                  }
                  puVar77 = puVar77 + iVar85;
                  bVar60 = 1 < iVar71;
                  iVar71 = iVar71 + -1;
                } while (bVar60);
                iVar85 = psVar89[1].cff.cursor;
              }
              iVar91 = iVar91 + 1;
              lVar88 = lVar88 + 0x18;
            } while (iVar91 < iVar85);
          }
        }
        psVar89[1].hmtx = 0;
        psVar89[1].kern = 0;
      }
      lVar110 = local_3b8 + 1;
    } while (lVar110 != lVar83);
  }
  ImGui::MemFree(local_440);
  ImGui::MemFree(local_328);
  pvVar73 = pvStack_3e0;
  if (pvStack_3e0 != (void *)0x0) {
    auVar51._8_8_ = 0;
    auVar51._0_8_ = pvStack_3e0;
    _local_3e8 = (stbtt__buf)(auVar51 << 0x40);
    ImGui::MemFree(pvVar73);
    pvStack_3e0._0_4_ = 0;
    pvStack_3e0._4_4_ = 0;
  }
  if ((int)uVar12 < 1) {
    if (local_4e0 == (void *)0x0) goto LAB_0016d4c8;
  }
  else {
    lVar110 = 0;
    sVar125 = DAT_001bcf90._6_2_;
    sVar123 = DAT_001bcf90._4_2_;
    sVar121 = DAT_001bcf90._2_2_;
    sVar113 = (short)DAT_001bcf90;
    do {
      lVar99 = lVar110 * 0x110;
      iVar85 = *(int *)((long)local_4e0 + lVar99 + 0xe8);
      if (iVar85 != 0) {
        if ((atlas_00->ConfigData).Size <= lVar110) goto LAB_0016d618;
        pIVar16 = (atlas_00->ConfigData).Data;
        pIVar102 = pIVar16 + lVar110;
        pIVar13 = pIVar16[lVar110].DstFont;
        if (pIVar16[lVar110].MergeMode == true) {
          uVar11 = pIVar13->ConfigDataCount;
          sVar82 = uVar11 + 1;
          fVar126 = pIVar13->Ascent;
        }
        else {
          _local_488 = ZEXT416((uint)pIVar16[lVar110].SizePixels);
          lVar88 = *(long *)((long)local_4e0 + lVar99 + 8);
          lVar109 = (long)*(int *)((long)local_4e0 + lVar99 + 0x24);
          bVar112 = *(byte *)(lVar88 + 4 + lVar109);
          bVar7 = *(byte *)(lVar88 + 5 + lVar109);
          bVar8 = *(byte *)(lVar88 + 7 + lVar109);
          bVar9 = *(byte *)(lVar88 + 6 + lVar109);
          ImFont::ClearOutputData(pIVar13);
          iVar85 = (uint)bVar9 * 0x100 + (uint)bVar112;
          auVar38._1_9_ = (unkuint9)0 << 8;
          auVar38[0] = (char)((uint)iVar85 >> 0x10);
          auVar38._10_6_ = 0;
          auVar55._1_12_ = SUB1612(auVar38 << 0x28,4);
          auVar55[0] = (char)((uint)iVar85 >> 8);
          auVar55[0xd] = 0;
          auVar56._1_14_ = auVar55 << 8;
          auVar56[0] = (char)iVar85;
          auVar56[0xf] = 0;
          auVar127 = ZEXT416((uint)bVar7 | (uint)bVar8 << 0x10) | auVar56 << 8;
          sVar62 = auVar127._0_2_;
          sVar82 = auVar127._2_2_;
          fVar92 = (float)((int)sVar62 - (int)sVar82);
          sVar124 = auVar127._4_2_;
          auVar57._4_6_ = 0;
          auVar57._0_4_ = fVar92;
          auVar57._10_2_ = sVar124;
          auVar58._8_4_ = auVar57._8_4_;
          auVar58._6_2_ = sVar82;
          auVar58._4_2_ = (short)((uint)fVar92 >> 0x10);
          auVar58._0_4_ = fVar92;
          auVar134._0_2_ = -(ushort)(sVar62 < sVar113);
          auVar134._2_2_ = -(ushort)(sVar62 < sVar113);
          auVar134._4_2_ = -(ushort)(sVar82 < sVar121);
          auVar134._6_2_ = -(ushort)(sVar82 < sVar121);
          auVar134._8_2_ = -(ushort)(sVar124 < sVar123);
          auVar134._10_2_ = -(ushort)(sVar124 < sVar123);
          auVar134._12_2_ = -(ushort)(0 < sVar125);
          auVar134._14_2_ = -(ushort)(0 < sVar125);
          auVar127 = auVar134 & _DAT_001a75e0 | ~auVar134 & _DAT_001a7610;
          fVar126 = (float)(int)(((float)local_488._0_4_ / fVar92) * (float)(int)sVar62 +
                                auVar127._0_4_);
          pIVar13->FontSize = pIVar102->SizePixels;
          pIVar13->ConfigData = pIVar102;
          pIVar13->ContainerAtlas = atlas_00;
          pIVar13->Ascent = fVar126;
          pIVar13->Descent =
               (float)(int)(((float)local_488._0_4_ / fVar92) * (float)(auVar58._4_4_ >> 0x10) +
                           auVar127._4_4_);
          iVar85 = *(int *)((long)local_4e0 + lVar99 + 0xe8);
          sVar82 = 1;
        }
        pIVar13->ConfigDataCount = sVar82;
        if (0 < iVar85) {
          local_488._0_4_ = (pIVar102->GlyphOffset).x;
          fVar126 = (float)(int)(fVar126 + 0.5) + (pIVar102->GlyphOffset).y;
          lVar109 = 0;
          lVar88 = 0;
          do {
            if (*(int *)((long)local_4e0 + lVar99 + 0x100) <= lVar88) goto LAB_0016d55e;
            lVar17 = *(long *)((long)local_4e0 + lVar99 + 0xd0);
            fVar154 = 1.0 / (float)atlas_00->TexHeight;
            fVar92 = 1.0 / (float)atlas_00->TexWidth;
            ImFont::AddGlyph(pIVar13,pIVar102,
                             *(ImWchar *)(*(long *)((long)local_4e0 + lVar99 + 0x108) + lVar88 * 4),
                             *(float *)(lVar17 + 8 + lVar109) + 0.0 + (float)local_488._0_4_,
                             *(float *)(lVar17 + 0xc + lVar109) + 0.0 + fVar126,
                             *(float *)(lVar17 + 0x14 + lVar109) + 0.0 + (float)local_488._0_4_,
                             *(float *)(lVar17 + 0x18 + lVar109) + 0.0 + fVar126,
                             (float)*(ushort *)(lVar17 + lVar109) * fVar92,
                             (float)*(ushort *)(lVar17 + 2 + lVar109) * fVar154,
                             (float)*(ushort *)(lVar17 + 4 + lVar109) * fVar92,
                             (float)*(ushort *)(lVar17 + 6 + lVar109) * fVar154,
                             *(float *)(lVar17 + 0x10 + lVar109));
            lVar88 = lVar88 + 1;
            lVar109 = lVar109 + 0x1c;
          } while (lVar88 < *(int *)((long)local_4e0 + lVar99 + 0xe8));
        }
      }
      lVar110 = lVar110 + 1;
    } while (lVar110 != lVar83);
    if (0 < (int)uVar12) {
      sVar90 = 0;
      do {
        pvVar73 = *(void **)((long)local_4e0 + sVar90 + 0x108);
        if (pvVar73 != (void *)0x0) {
          ImGui::MemFree(pvVar73);
        }
        pvVar73 = *(void **)((long)local_4e0 + sVar90 + 0xf8);
        if (pvVar73 != (void *)0x0) {
          ImGui::MemFree(pvVar73);
        }
        sVar90 = sVar90 + 0x110;
      } while (local_2f8 != sVar90);
    }
  }
  ImGui::MemFree(local_4e0);
LAB_0016d4c8:
  ImFontAtlasBuildFinish(atlas_00);
  if (pvStack_390 != (void *)0x0) {
    ImGui::MemFree(pvStack_390);
  }
  return true;
LAB_0016d70b:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_0016d573;
LAB_0016d618:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_0016d573;
LAB_0016d55e:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_0016d573:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                ,0x703,__function);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}